

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx512::CurveNiIntersectorK<4,8>::
     intersect_hn<embree::avx512::OrientedCurve1IntersectorK<embree::HermiteCurveT,8>,embree::avx512::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  Primitive PVar3;
  uint uVar4;
  uint uVar5;
  Geometry *pGVar6;
  long lVar7;
  __int_type_conflict _Var8;
  RTCFilterFunctionN p_Var9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  undefined8 uVar19;
  undefined8 uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [28];
  undefined1 auVar24 [28];
  undefined1 auVar25 [28];
  undefined1 auVar26 [28];
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  byte bVar34;
  uint uVar35;
  ulong uVar36;
  uint uVar38;
  ulong uVar39;
  long lVar40;
  uint uVar41;
  ulong uVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 in_YmmResult [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar94 [32];
  undefined1 auVar96 [32];
  undefined1 auVar98 [32];
  undefined1 auVar100 [32];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  int iVar108;
  float fVar109;
  vint4 bi_2;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined4 uVar112;
  float fVar123;
  float fVar124;
  vint4 bi_1;
  float fVar125;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [32];
  vint4 bi;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  vint4 ai_2;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  vint4 ai;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [32];
  vint4 ai_1;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar165 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  float fVar181;
  float fVar182;
  vfloat4 a0_3;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  __m128 a_1;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [32];
  float fVar202;
  float fVar214;
  float fVar215;
  __m128 a;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  float fVar216;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  float fVar217;
  float fVar218;
  float fVar219;
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  float fVar226;
  float fVar235;
  float fVar236;
  vfloat4 a0_1;
  float fVar237;
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  float fVar238;
  float fVar246;
  float fVar247;
  vfloat4 a0;
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  float fVar248;
  undefined1 auVar245 [64];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [64];
  undefined1 auVar256 [64];
  undefined1 in_ZMM19 [64];
  undefined1 auVar257 [64];
  undefined1 auVar258 [64];
  undefined1 auVar259 [64];
  int iVar260;
  undefined1 in_ZMM29 [64];
  undefined1 auVar261 [64];
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  RTCFilterFunctionNArguments local_460;
  undefined1 local_430 [16];
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  uint auStack_3f0 [4];
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [8];
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  undefined1 local_380 [16];
  undefined1 local_370 [8];
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  undefined1 local_350 [16];
  undefined1 local_340 [16];
  undefined1 local_330 [8];
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [16];
  undefined1 local_310 [8];
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  undefined1 local_280 [16];
  undefined1 local_270 [16];
  uint uStack_260;
  float afStack_25c [7];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar37;
  undefined1 auVar93 [32];
  undefined1 auVar95 [32];
  undefined1 auVar97 [32];
  undefined1 auVar99 [32];
  undefined1 auVar101 [32];
  uint uVar107;
  
  PVar3 = prim[1];
  uVar39 = (ulong)(byte)PVar3;
  fVar109 = *(float *)(prim + uVar39 * 0x19 + 0x12);
  auVar43 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar43 = vinsertps_avx(auVar43,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar44 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar44 = vinsertps_avx(auVar44,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar43 = vsubps_avx(auVar43,*(undefined1 (*) [16])(prim + uVar39 * 0x19 + 6));
  auVar63._0_4_ = fVar109 * auVar43._0_4_;
  auVar63._4_4_ = fVar109 * auVar43._4_4_;
  auVar63._8_4_ = fVar109 * auVar43._8_4_;
  auVar63._12_4_ = fVar109 * auVar43._12_4_;
  auVar54._0_4_ = fVar109 * auVar44._0_4_;
  auVar54._4_4_ = fVar109 * auVar44._4_4_;
  auVar54._8_4_ = fVar109 * auVar44._8_4_;
  auVar54._12_4_ = fVar109 * auVar44._12_4_;
  auVar43 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar39 * 4 + 6)));
  auVar43 = vcvtdq2ps_avx(auVar43);
  auVar44 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar39 * 5 + 6)));
  auVar44 = vcvtdq2ps_avx(auVar44);
  auVar45 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar39 * 6 + 6)));
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar39 * 0xb + 6)));
  auVar45 = vcvtdq2ps_avx(auVar45);
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar55 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6)));
  auVar55 = vcvtdq2ps_avx(auVar55);
  auVar51 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar3 * 0xc + uVar39 + 6)));
  auVar51 = vcvtdq2ps_avx(auVar51);
  uVar42 = (ulong)(uint)((int)(uVar39 * 9) * 2);
  auVar48 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar42 + 6)));
  auVar48 = vcvtdq2ps_avx(auVar48);
  auVar47 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar42 + uVar39 + 6)));
  auVar47 = vcvtdq2ps_avx(auVar47);
  uVar36 = (ulong)(uint)((int)(uVar39 * 5) << 2);
  auVar49 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar36 + 6)));
  auVar49 = vcvtdq2ps_avx(auVar49);
  auVar239._4_4_ = auVar54._0_4_;
  auVar239._0_4_ = auVar54._0_4_;
  auVar239._8_4_ = auVar54._0_4_;
  auVar239._12_4_ = auVar54._0_4_;
  auVar50 = vshufps_avx(auVar54,auVar54,0x55);
  auVar46 = vshufps_avx(auVar54,auVar54,0xaa);
  fVar109 = auVar46._0_4_;
  auVar66._0_4_ = fVar109 * auVar45._0_4_;
  fVar219 = auVar46._4_4_;
  auVar66._4_4_ = fVar219 * auVar45._4_4_;
  fVar202 = auVar46._8_4_;
  auVar66._8_4_ = fVar202 * auVar45._8_4_;
  fVar214 = auVar46._12_4_;
  auVar66._12_4_ = fVar214 * auVar45._12_4_;
  auVar57._0_4_ = auVar51._0_4_ * fVar109;
  auVar57._4_4_ = auVar51._4_4_ * fVar219;
  auVar57._8_4_ = auVar51._8_4_ * fVar202;
  auVar57._12_4_ = auVar51._12_4_ * fVar214;
  auVar56._0_4_ = auVar49._0_4_ * fVar109;
  auVar56._4_4_ = auVar49._4_4_ * fVar219;
  auVar56._8_4_ = auVar49._8_4_ * fVar202;
  auVar56._12_4_ = auVar49._12_4_ * fVar214;
  auVar46 = vfmadd231ps_fma(auVar66,auVar50,auVar44);
  auVar52 = vfmadd231ps_fma(auVar57,auVar50,auVar55);
  auVar50 = vfmadd231ps_fma(auVar56,auVar47,auVar50);
  auVar53 = vfmadd231ps_fma(auVar46,auVar239,auVar43);
  auVar52 = vfmadd231ps_fma(auVar52,auVar239,auVar18);
  auVar54 = vfmadd231ps_fma(auVar50,auVar48,auVar239);
  auVar68._4_4_ = auVar63._0_4_;
  auVar68._0_4_ = auVar63._0_4_;
  auVar68._8_4_ = auVar63._0_4_;
  auVar68._12_4_ = auVar63._0_4_;
  auVar50 = vshufps_avx(auVar63,auVar63,0x55);
  auVar46 = vshufps_avx(auVar63,auVar63,0xaa);
  fVar109 = auVar46._0_4_;
  auVar254._0_4_ = fVar109 * auVar45._0_4_;
  fVar219 = auVar46._4_4_;
  auVar254._4_4_ = fVar219 * auVar45._4_4_;
  fVar202 = auVar46._8_4_;
  auVar254._8_4_ = fVar202 * auVar45._8_4_;
  fVar214 = auVar46._12_4_;
  auVar254._12_4_ = fVar214 * auVar45._12_4_;
  auVar59._0_4_ = auVar51._0_4_ * fVar109;
  auVar59._4_4_ = auVar51._4_4_ * fVar219;
  auVar59._8_4_ = auVar51._8_4_ * fVar202;
  auVar59._12_4_ = auVar51._12_4_ * fVar214;
  auVar58._0_4_ = auVar49._0_4_ * fVar109;
  auVar58._4_4_ = auVar49._4_4_ * fVar219;
  auVar58._8_4_ = auVar49._8_4_ * fVar202;
  auVar58._12_4_ = auVar49._12_4_ * fVar214;
  auVar44 = vfmadd231ps_fma(auVar254,auVar50,auVar44);
  auVar45 = vfmadd231ps_fma(auVar59,auVar50,auVar55);
  auVar55 = vfmadd231ps_fma(auVar58,auVar50,auVar47);
  auVar51 = vfmadd231ps_fma(auVar44,auVar68,auVar43);
  auVar47 = vfmadd231ps_fma(auVar45,auVar68,auVar18);
  auVar73._16_16_ = in_YmmResult._16_16_;
  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar258 = ZEXT1664(auVar43);
  auVar49 = vfmadd231ps_fma(auVar55,auVar68,auVar48);
  auVar44 = vandps_avx512vl(auVar53,auVar43);
  auVar61._8_4_ = 0x219392ef;
  auVar61._0_8_ = 0x219392ef219392ef;
  auVar61._12_4_ = 0x219392ef;
  uVar42 = vcmpps_avx512vl(auVar44,auVar61,1);
  bVar10 = (bool)((byte)uVar42 & 1);
  auVar46._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar53._0_4_;
  bVar10 = (bool)((byte)(uVar42 >> 1) & 1);
  auVar46._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar53._4_4_;
  bVar10 = (bool)((byte)(uVar42 >> 2) & 1);
  auVar46._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar53._8_4_;
  bVar10 = (bool)((byte)(uVar42 >> 3) & 1);
  auVar46._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar53._12_4_;
  auVar44 = vandps_avx512vl(auVar52,auVar43);
  uVar42 = vcmpps_avx512vl(auVar44,auVar61,1);
  bVar10 = (bool)((byte)uVar42 & 1);
  auVar53._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar52._0_4_;
  bVar10 = (bool)((byte)(uVar42 >> 1) & 1);
  auVar53._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar52._4_4_;
  bVar10 = (bool)((byte)(uVar42 >> 2) & 1);
  auVar53._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar52._8_4_;
  bVar10 = (bool)((byte)(uVar42 >> 3) & 1);
  auVar53._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar52._12_4_;
  auVar43 = vandps_avx512vl(auVar54,auVar43);
  uVar42 = vcmpps_avx512vl(auVar43,auVar61,1);
  bVar10 = (bool)((byte)uVar42 & 1);
  auVar52._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar54._0_4_;
  bVar10 = (bool)((byte)(uVar42 >> 1) & 1);
  auVar52._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar54._4_4_;
  bVar10 = (bool)((byte)(uVar42 >> 2) & 1);
  auVar52._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar54._8_4_;
  bVar10 = (bool)((byte)(uVar42 >> 3) & 1);
  auVar52._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar54._12_4_;
  auVar43 = vrcp14ps_avx512vl(auVar46);
  auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar259 = ZEXT1664(auVar44);
  auVar45 = vfnmadd213ps_avx512vl(auVar46,auVar43,auVar44);
  auVar18 = vfmadd132ps_fma(auVar45,auVar43,auVar43);
  auVar43 = vrcp14ps_avx512vl(auVar53);
  auVar45 = vfnmadd213ps_avx512vl(auVar53,auVar43,auVar44);
  auVar55 = vfmadd132ps_fma(auVar45,auVar43,auVar43);
  auVar43 = vrcp14ps_avx512vl(auVar52);
  auVar44 = vfnmadd213ps_avx512vl(auVar52,auVar43,auVar44);
  auVar48 = vfmadd132ps_fma(auVar44,auVar43,auVar43);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = *(ulong *)(prim + uVar39 * 7 + 6);
  auVar43 = vpmovsxwd_avx(auVar43);
  auVar43 = vcvtdq2ps_avx(auVar43);
  auVar43 = vsubps_avx(auVar43,auVar51);
  auVar69._0_4_ = auVar18._0_4_ * auVar43._0_4_;
  auVar69._4_4_ = auVar18._4_4_ * auVar43._4_4_;
  auVar69._8_4_ = auVar18._8_4_ * auVar43._8_4_;
  auVar69._12_4_ = auVar18._12_4_ * auVar43._12_4_;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = *(ulong *)(prim + uVar39 * 9 + 6);
  auVar43 = vpmovsxwd_avx(auVar44);
  auVar43 = vcvtdq2ps_avx(auVar43);
  auVar43 = vsubps_avx(auVar43,auVar51);
  auVar46 = vpbroadcastd_avx512vl();
  auVar45._8_8_ = 0;
  auVar45._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar44 = vpmovsxwd_avx(auVar45);
  auVar67._0_4_ = auVar18._0_4_ * auVar43._0_4_;
  auVar67._4_4_ = auVar18._4_4_ * auVar43._4_4_;
  auVar67._8_4_ = auVar18._8_4_ * auVar43._8_4_;
  auVar67._12_4_ = auVar18._12_4_ * auVar43._12_4_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar39 * -2 + 6);
  auVar43 = vpmovsxwd_avx(auVar18);
  auVar43 = vcvtdq2ps_avx(auVar43);
  auVar43 = vsubps_avx(auVar43,auVar47);
  auVar62._0_4_ = auVar55._0_4_ * auVar43._0_4_;
  auVar62._4_4_ = auVar55._4_4_ * auVar43._4_4_;
  auVar62._8_4_ = auVar55._8_4_ * auVar43._8_4_;
  auVar62._12_4_ = auVar55._12_4_ * auVar43._12_4_;
  auVar43 = vcvtdq2ps_avx(auVar44);
  auVar43 = vsubps_avx(auVar43,auVar47);
  auVar65._0_4_ = auVar55._0_4_ * auVar43._0_4_;
  auVar65._4_4_ = auVar55._4_4_ * auVar43._4_4_;
  auVar65._8_4_ = auVar55._8_4_ * auVar43._8_4_;
  auVar65._12_4_ = auVar55._12_4_ * auVar43._12_4_;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = *(ulong *)(prim + uVar36 + uVar39 + 6);
  auVar43 = vpmovsxwd_avx(auVar55);
  auVar43 = vcvtdq2ps_avx(auVar43);
  auVar43 = vsubps_avx(auVar43,auVar49);
  auVar60._0_4_ = auVar48._0_4_ * auVar43._0_4_;
  auVar60._4_4_ = auVar48._4_4_ * auVar43._4_4_;
  auVar60._8_4_ = auVar48._8_4_ * auVar43._8_4_;
  auVar60._12_4_ = auVar48._12_4_ * auVar43._12_4_;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = *(ulong *)(prim + uVar39 * 0x17 + 6);
  auVar43 = vpmovsxwd_avx(auVar51);
  auVar43 = vcvtdq2ps_avx(auVar43);
  auVar43 = vsubps_avx(auVar43,auVar49);
  auVar64._0_4_ = auVar48._0_4_ * auVar43._0_4_;
  auVar64._4_4_ = auVar48._4_4_ * auVar43._4_4_;
  auVar64._8_4_ = auVar48._8_4_ * auVar43._8_4_;
  auVar64._12_4_ = auVar48._12_4_ * auVar43._12_4_;
  auVar43 = vpminsd_avx(auVar69,auVar67);
  auVar44 = vpminsd_avx(auVar62,auVar65);
  auVar43 = vmaxps_avx(auVar43,auVar44);
  auVar44 = vpminsd_avx(auVar60,auVar64);
  uVar112 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar48._4_4_ = uVar112;
  auVar48._0_4_ = uVar112;
  auVar48._8_4_ = uVar112;
  auVar48._12_4_ = uVar112;
  auVar44 = vmaxps_avx512vl(auVar44,auVar48);
  auVar43 = vmaxps_avx(auVar43,auVar44);
  auVar47._8_4_ = 0x3f7ffffa;
  auVar47._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar47._12_4_ = 0x3f7ffffa;
  local_3c0 = vmulps_avx512vl(auVar43,auVar47);
  auVar43 = vpmaxsd_avx(auVar69,auVar67);
  auVar44 = vpmaxsd_avx(auVar62,auVar65);
  auVar43 = vminps_avx(auVar43,auVar44);
  auVar44 = vpmaxsd_avx(auVar60,auVar64);
  uVar112 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar49._4_4_ = uVar112;
  auVar49._0_4_ = uVar112;
  auVar49._8_4_ = uVar112;
  auVar49._12_4_ = uVar112;
  auVar44 = vminps_avx512vl(auVar44,auVar49);
  auVar43 = vminps_avx(auVar43,auVar44);
  auVar50._8_4_ = 0x3f800003;
  auVar50._0_8_ = 0x3f8000033f800003;
  auVar50._12_4_ = 0x3f800003;
  auVar43 = vmulps_avx512vl(auVar43,auVar50);
  uVar19 = vcmpps_avx512vl(local_3c0,auVar43,2);
  uVar42 = vpcmpgtd_avx512vl(auVar46,_DAT_01ff0cf0);
  uVar42 = ((byte)uVar19 & 0xf) & uVar42;
  if ((char)uVar42 == '\0') {
    return;
  }
  local_240 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar255 = ZEXT1664(auVar43);
  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar256 = ZEXT1664(auVar43);
  auVar43 = vxorps_avx512vl(in_ZMM29._0_16_,in_ZMM29._0_16_);
  auVar261 = ZEXT1664(auVar43);
LAB_01b3ee86:
  lVar40 = 0;
  for (uVar36 = uVar42; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000) {
    lVar40 = lVar40 + 1;
  }
  uVar41 = *(uint *)(prim + 2);
  uVar4 = *(uint *)(prim + lVar40 * 4 + 6);
  pGVar6 = (context->scene->geometries).items[uVar41].ptr;
  lVar7 = *(long *)&pGVar6[1].time_range.upper;
  uVar36 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                           (ulong)uVar4 *
                           pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar43 = *(undefined1 (*) [16])(lVar7 + (long)pGVar6[1].intersectionFilterN * uVar36);
  lVar40 = uVar36 + 1;
  auVar44 = *(undefined1 (*) [16])(lVar7 + (long)pGVar6[1].intersectionFilterN * lVar40);
  _Var8 = pGVar6[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar45 = *(undefined1 (*) [16])(_Var8 + (long)pGVar6[2].userPtr * uVar36);
  auVar18 = *(undefined1 (*) [16])(_Var8 + (long)pGVar6[2].userPtr * lVar40);
  auVar55 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar55 = vinsertps_avx(auVar55,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar109 = *(float *)(ray + k * 4 + 0x60);
  auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
  auVar48 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (pGVar6[2].intersectionFilterN + (long)pGVar6[2].pointQueryFunc * uVar36),
                       auVar43,auVar47);
  auVar49 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (pGVar6[2].intersectionFilterN + (long)pGVar6[2].pointQueryFunc * lVar40),
                       auVar44,auVar47);
  auVar50 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        ((long)pGVar6[3].userPtr + uVar36 * *(long *)&pGVar6[3].fnumTimeSegments),
                       auVar45,auVar47);
  auVar46 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        ((long)pGVar6[3].userPtr + *(long *)&pGVar6[3].fnumTimeSegments * lVar40),
                       auVar18,auVar47);
  auVar87._0_16_ = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
  auVar51 = vmulps_avx512vl(auVar44,auVar87._0_16_);
  auVar52 = vfmadd231ps_avx512vl(auVar51,auVar49,auVar87._0_16_);
  auVar51 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar48,auVar52);
  auVar126._0_4_ = auVar43._0_4_ + auVar51._0_4_;
  auVar126._4_4_ = auVar43._4_4_ + auVar51._4_4_;
  auVar126._8_4_ = auVar43._8_4_ + auVar51._8_4_;
  auVar126._12_4_ = auVar43._12_4_ + auVar51._12_4_;
  auVar56 = auVar255._0_16_;
  auVar51 = vfmadd231ps_avx512vl(auVar52,auVar48,auVar56);
  auVar52 = vfnmadd231ps_avx512vl(auVar51,auVar43,auVar56);
  auVar51 = vmulps_avx512vl(auVar18,auVar87._0_16_);
  auVar53 = vfmadd231ps_avx512vl(auVar51,auVar46,auVar87._0_16_);
  auVar51 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar50,auVar53);
  auVar240._0_4_ = auVar45._0_4_ + auVar51._0_4_;
  auVar240._4_4_ = auVar45._4_4_ + auVar51._4_4_;
  auVar240._8_4_ = auVar45._8_4_ + auVar51._8_4_;
  auVar240._12_4_ = auVar45._12_4_ + auVar51._12_4_;
  auVar51 = vfmadd231ps_avx512vl(auVar53,auVar50,auVar56);
  auVar53 = vfnmadd231ps_avx512vl(auVar51,auVar45,auVar56);
  auVar51 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar49,auVar44);
  auVar51 = vfmadd231ps_avx512vl(auVar51,auVar48,auVar87._0_16_);
  auVar54 = vfmadd231ps_avx512vl(auVar51,auVar43,auVar87._0_16_);
  auVar44 = vmulps_avx512vl(auVar44,auVar56);
  auVar44 = vfnmadd231ps_avx512vl(auVar44,auVar56,auVar49);
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar87._0_16_,auVar48);
  auVar49 = vfnmadd231ps_avx512vl(auVar44,auVar87._0_16_,auVar43);
  auVar43 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar46,auVar18);
  auVar43 = vfmadd231ps_avx512vl(auVar43,auVar50,auVar87._0_16_);
  auVar51 = vfmadd231ps_avx512vl(auVar43,auVar45,auVar87._0_16_);
  auVar43 = vmulps_avx512vl(auVar18,auVar56);
  auVar43 = vfnmadd231ps_avx512vl(auVar43,auVar56,auVar46);
  auVar43 = vfmadd231ps_avx512vl(auVar43,auVar87._0_16_,auVar50);
  auVar48 = vfnmadd231ps_avx512vl(auVar43,auVar87._0_16_,auVar45);
  auVar43 = vshufps_avx(auVar52,auVar52,0xc9);
  auVar44 = vshufps_avx(auVar240,auVar240,0xc9);
  fVar218 = auVar52._0_4_;
  auVar170._0_4_ = fVar218 * auVar44._0_4_;
  fVar123 = auVar52._4_4_;
  auVar170._4_4_ = fVar123 * auVar44._4_4_;
  fVar124 = auVar52._8_4_;
  auVar170._8_4_ = fVar124 * auVar44._8_4_;
  fVar125 = auVar52._12_4_;
  auVar170._12_4_ = fVar125 * auVar44._12_4_;
  auVar44 = vfmsub231ps_fma(auVar170,auVar43,auVar240);
  auVar45 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar44 = vshufps_avx(auVar53,auVar53,0xc9);
  auVar197._0_4_ = auVar44._0_4_ * fVar218;
  auVar197._4_4_ = auVar44._4_4_ * fVar123;
  auVar197._8_4_ = auVar44._8_4_ * fVar124;
  auVar197._12_4_ = auVar44._12_4_ * fVar125;
  auVar43 = vfmsub231ps_fma(auVar197,auVar43,auVar53);
  auVar18 = vshufps_avx(auVar43,auVar43,0xc9);
  auVar43 = vshufps_avx(auVar49,auVar49,0xc9);
  auVar44 = vshufps_avx(auVar51,auVar51,0xc9);
  fVar219 = auVar49._0_4_;
  auVar203._0_4_ = auVar44._0_4_ * fVar219;
  fVar202 = auVar49._4_4_;
  auVar203._4_4_ = auVar44._4_4_ * fVar202;
  fVar214 = auVar49._8_4_;
  auVar203._8_4_ = auVar44._8_4_ * fVar214;
  fVar215 = auVar49._12_4_;
  auVar203._12_4_ = auVar44._12_4_ * fVar215;
  auVar44 = vfmsub231ps_fma(auVar203,auVar43,auVar51);
  auVar51 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar44 = vshufps_avx(auVar48,auVar48,0xc9);
  auVar204._0_4_ = auVar44._0_4_ * fVar219;
  auVar204._4_4_ = auVar44._4_4_ * fVar202;
  auVar204._8_4_ = auVar44._8_4_ * fVar214;
  auVar204._12_4_ = auVar44._12_4_ * fVar215;
  auVar43 = vfmsub231ps_fma(auVar204,auVar43,auVar48);
  auVar48 = vshufps_avx(auVar43,auVar43,0xc9);
  auVar43 = vdpps_avx(auVar45,auVar45,0x7f);
  fVar181 = auVar43._0_4_;
  auVar87._16_16_ = auVar73._16_16_;
  auVar84._4_28_ = auVar87._4_28_;
  auVar84._0_4_ = fVar181;
  auVar44 = vrsqrt14ss_avx512f(auVar87._0_16_,auVar84._0_16_);
  fVar182 = auVar44._0_4_;
  auVar44 = vmulss_avx512f(auVar43,ZEXT416(0x3f000000));
  fVar216 = fVar182 * 1.5 - auVar44._0_4_ * fVar182 * fVar182 * fVar182;
  auVar44 = vdpps_avx(auVar45,auVar18,0x7f);
  fVar238 = fVar216 * auVar45._0_4_;
  fVar246 = fVar216 * auVar45._4_4_;
  fVar247 = fVar216 * auVar45._8_4_;
  fVar248 = fVar216 * auVar45._12_4_;
  auVar198._0_4_ = fVar181 * auVar18._0_4_;
  auVar198._4_4_ = fVar181 * auVar18._4_4_;
  auVar198._8_4_ = fVar181 * auVar18._8_4_;
  auVar198._12_4_ = fVar181 * auVar18._12_4_;
  fVar181 = auVar44._0_4_;
  auVar171._0_4_ = fVar181 * auVar45._0_4_;
  auVar171._4_4_ = fVar181 * auVar45._4_4_;
  auVar171._8_4_ = fVar181 * auVar45._8_4_;
  auVar171._12_4_ = fVar181 * auVar45._12_4_;
  auVar45 = vsubps_avx(auVar198,auVar171);
  auVar44 = vrcp14ss_avx512f(auVar87._0_16_,auVar84._0_16_);
  auVar43 = vfnmadd213ss_avx512f(auVar43,auVar44,ZEXT416(0x40000000));
  fVar181 = auVar44._0_4_ * auVar43._0_4_;
  auVar43 = vdpps_avx(auVar51,auVar51,0x7f);
  fVar182 = auVar43._0_4_;
  auVar85._16_16_ = auVar73._16_16_;
  auVar85._0_16_ = auVar87._0_16_;
  auVar86._4_28_ = auVar85._4_28_;
  auVar86._0_4_ = fVar182;
  auVar44 = vrsqrt14ss_avx512f(auVar87._0_16_,auVar86._0_16_);
  fVar217 = auVar44._0_4_;
  auVar44 = vmulss_avx512f(auVar43,ZEXT416(0x3f000000));
  fVar217 = fVar217 * 1.5 - auVar44._0_4_ * fVar217 * fVar217 * fVar217;
  auVar44 = vdpps_avx(auVar51,auVar48,0x7f);
  fVar226 = fVar217 * auVar51._0_4_;
  fVar235 = fVar217 * auVar51._4_4_;
  fVar236 = fVar217 * auVar51._8_4_;
  fVar237 = fVar217 * auVar51._12_4_;
  auVar160._0_4_ = fVar182 * auVar48._0_4_;
  auVar160._4_4_ = fVar182 * auVar48._4_4_;
  auVar160._8_4_ = fVar182 * auVar48._8_4_;
  auVar160._12_4_ = fVar182 * auVar48._12_4_;
  fVar182 = auVar44._0_4_;
  auVar152._0_4_ = fVar182 * auVar51._0_4_;
  auVar152._4_4_ = fVar182 * auVar51._4_4_;
  auVar152._8_4_ = fVar182 * auVar51._8_4_;
  auVar152._12_4_ = fVar182 * auVar51._12_4_;
  auVar18 = vsubps_avx(auVar160,auVar152);
  auVar44 = vrcp14ss_avx512f(auVar87._0_16_,auVar86._0_16_);
  auVar43 = vfnmadd213ss_avx512f(auVar43,auVar44,ZEXT416(0x40000000));
  fVar182 = auVar43._0_4_ * auVar44._0_4_;
  auVar43 = vshufps_avx(auVar126,auVar126,0xff);
  auVar183._0_4_ = fVar238 * auVar43._0_4_;
  auVar183._4_4_ = fVar246 * auVar43._4_4_;
  auVar183._8_4_ = fVar247 * auVar43._8_4_;
  auVar183._12_4_ = fVar248 * auVar43._12_4_;
  local_300 = vsubps_avx(auVar126,auVar183);
  auVar44 = vshufps_avx(auVar52,auVar52,0xff);
  auVar161._0_4_ = auVar44._0_4_ * fVar238 + auVar43._0_4_ * fVar216 * fVar181 * auVar45._0_4_;
  auVar161._4_4_ = auVar44._4_4_ * fVar246 + auVar43._4_4_ * fVar216 * fVar181 * auVar45._4_4_;
  auVar161._8_4_ = auVar44._8_4_ * fVar247 + auVar43._8_4_ * fVar216 * fVar181 * auVar45._8_4_;
  auVar161._12_4_ = auVar44._12_4_ * fVar248 + auVar43._12_4_ * fVar216 * fVar181 * auVar45._12_4_;
  auVar45 = vsubps_avx(auVar52,auVar161);
  local_310._0_4_ = auVar183._0_4_ + auVar126._0_4_;
  local_310._4_4_ = auVar183._4_4_ + auVar126._4_4_;
  fStack_308 = auVar183._8_4_ + auVar126._8_4_;
  fStack_304 = auVar183._12_4_ + auVar126._12_4_;
  auVar113._0_4_ = fVar218 + auVar161._0_4_;
  auVar113._4_4_ = fVar123 + auVar161._4_4_;
  auVar113._8_4_ = fVar124 + auVar161._8_4_;
  auVar113._12_4_ = fVar125 + auVar161._12_4_;
  auVar43 = vshufps_avx(auVar54,auVar54,0xff);
  auVar162._0_4_ = fVar226 * auVar43._0_4_;
  auVar162._4_4_ = fVar235 * auVar43._4_4_;
  auVar162._8_4_ = fVar236 * auVar43._8_4_;
  auVar162._12_4_ = fVar237 * auVar43._12_4_;
  local_320 = vsubps_avx(auVar54,auVar162);
  auVar44 = vshufps_avx(auVar49,auVar49,0xff);
  auVar127._0_4_ = auVar44._0_4_ * fVar226 + auVar43._0_4_ * fVar217 * auVar18._0_4_ * fVar182;
  auVar127._4_4_ = auVar44._4_4_ * fVar235 + auVar43._4_4_ * fVar217 * auVar18._4_4_ * fVar182;
  auVar127._8_4_ = auVar44._8_4_ * fVar236 + auVar43._8_4_ * fVar217 * auVar18._8_4_ * fVar182;
  auVar127._12_4_ = auVar44._12_4_ * fVar237 + auVar43._12_4_ * fVar217 * auVar18._12_4_ * fVar182;
  auVar43 = vsubps_avx(auVar49,auVar127);
  _local_330 = vaddps_avx512vl(auVar54,auVar162);
  auVar128._0_4_ = fVar219 + auVar127._0_4_;
  auVar128._4_4_ = fVar202 + auVar127._4_4_;
  auVar128._8_4_ = fVar214 + auVar127._8_4_;
  auVar128._12_4_ = fVar215 + auVar127._12_4_;
  auVar44 = vmulps_avx512vl(auVar45,auVar47);
  local_340 = vaddps_avx512vl(local_300,auVar44);
  auVar43 = vmulps_avx512vl(auVar43,auVar47);
  local_350 = vsubps_avx512vl(local_320,auVar43);
  auVar43 = vmulps_avx512vl(auVar113,auVar47);
  _local_360 = vaddps_avx512vl(_local_310,auVar43);
  auVar43 = vmulps_avx512vl(auVar128,auVar47);
  _local_370 = vsubps_avx512vl(_local_330,auVar43);
  local_280 = vsubps_avx(local_300,auVar55);
  uVar112 = local_280._0_4_;
  auVar129._4_4_ = uVar112;
  auVar129._0_4_ = uVar112;
  auVar129._8_4_ = uVar112;
  auVar129._12_4_ = uVar112;
  auVar43 = vshufps_avx(local_280,local_280,0x55);
  auVar44 = vshufps_avx(local_280,local_280,0xaa);
  aVar1 = pre->ray_space[k].vx.field_0;
  aVar2 = pre->ray_space[k].vy.field_0;
  fVar219 = pre->ray_space[k].vz.field_0.m128[0];
  fVar202 = pre->ray_space[k].vz.field_0.m128[1];
  fVar214 = pre->ray_space[k].vz.field_0.m128[2];
  fVar215 = pre->ray_space[k].vz.field_0.m128[3];
  auVar114._0_4_ = fVar219 * auVar44._0_4_;
  auVar114._4_4_ = fVar202 * auVar44._4_4_;
  auVar114._8_4_ = fVar214 * auVar44._8_4_;
  auVar114._12_4_ = fVar215 * auVar44._12_4_;
  auVar43 = vfmadd231ps_fma(auVar114,(undefined1  [16])aVar2,auVar43);
  auVar48 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar1,auVar129);
  local_290 = vsubps_avx512vl(local_340,auVar55);
  uVar112 = local_290._0_4_;
  auVar134._4_4_ = uVar112;
  auVar134._0_4_ = uVar112;
  auVar134._8_4_ = uVar112;
  auVar134._12_4_ = uVar112;
  auVar43 = vshufps_avx(local_290,local_290,0x55);
  auVar44 = vshufps_avx(local_290,local_290,0xaa);
  auVar130._0_4_ = fVar219 * auVar44._0_4_;
  auVar130._4_4_ = fVar202 * auVar44._4_4_;
  auVar130._8_4_ = fVar214 * auVar44._8_4_;
  auVar130._12_4_ = fVar215 * auVar44._12_4_;
  auVar43 = vfmadd231ps_fma(auVar130,(undefined1  [16])aVar2,auVar43);
  auVar47 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar1,auVar134);
  local_2a0 = vsubps_avx512vl(local_350,auVar55);
  uVar112 = local_2a0._0_4_;
  auVar163._4_4_ = uVar112;
  auVar163._0_4_ = uVar112;
  auVar163._8_4_ = uVar112;
  auVar163._12_4_ = uVar112;
  auVar43 = vshufps_avx(local_2a0,local_2a0,0x55);
  auVar44 = vshufps_avx(local_2a0,local_2a0,0xaa);
  auVar135._0_4_ = fVar219 * auVar44._0_4_;
  auVar135._4_4_ = fVar202 * auVar44._4_4_;
  auVar135._8_4_ = fVar214 * auVar44._8_4_;
  auVar135._12_4_ = fVar215 * auVar44._12_4_;
  auVar43 = vfmadd231ps_fma(auVar135,(undefined1  [16])aVar2,auVar43);
  auVar49 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar1,auVar163);
  local_2b0 = vsubps_avx(local_320,auVar55);
  uVar112 = local_2b0._0_4_;
  auVar184._4_4_ = uVar112;
  auVar184._0_4_ = uVar112;
  auVar184._8_4_ = uVar112;
  auVar184._12_4_ = uVar112;
  auVar43 = vshufps_avx(local_2b0,local_2b0,0x55);
  auVar44 = vshufps_avx(local_2b0,local_2b0,0xaa);
  auVar164._0_4_ = fVar219 * auVar44._0_4_;
  auVar164._4_4_ = fVar202 * auVar44._4_4_;
  auVar164._8_4_ = fVar214 * auVar44._8_4_;
  auVar164._12_4_ = fVar215 * auVar44._12_4_;
  auVar43 = vfmadd231ps_fma(auVar164,(undefined1  [16])aVar2,auVar43);
  auVar50 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar1,auVar184);
  local_2c0 = vsubps_avx(_local_310,auVar55);
  uVar112 = local_2c0._0_4_;
  auVar185._4_4_ = uVar112;
  auVar185._0_4_ = uVar112;
  auVar185._8_4_ = uVar112;
  auVar185._12_4_ = uVar112;
  auVar43 = vshufps_avx(local_2c0,local_2c0,0x55);
  auVar44 = vshufps_avx(local_2c0,local_2c0,0xaa);
  auVar205._0_4_ = auVar44._0_4_ * fVar219;
  auVar205._4_4_ = auVar44._4_4_ * fVar202;
  auVar205._8_4_ = auVar44._8_4_ * fVar214;
  auVar205._12_4_ = auVar44._12_4_ * fVar215;
  auVar43 = vfmadd231ps_fma(auVar205,(undefined1  [16])aVar2,auVar43);
  auVar46 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar1,auVar185);
  local_2d0 = vsubps_avx512vl(_local_360,auVar55);
  uVar112 = local_2d0._0_4_;
  auVar186._4_4_ = uVar112;
  auVar186._0_4_ = uVar112;
  auVar186._8_4_ = uVar112;
  auVar186._12_4_ = uVar112;
  auVar43 = vshufps_avx(local_2d0,local_2d0,0x55);
  auVar44 = vshufps_avx(local_2d0,local_2d0,0xaa);
  auVar220._0_4_ = auVar44._0_4_ * fVar219;
  auVar220._4_4_ = auVar44._4_4_ * fVar202;
  auVar220._8_4_ = auVar44._8_4_ * fVar214;
  auVar220._12_4_ = auVar44._12_4_ * fVar215;
  auVar43 = vfmadd231ps_fma(auVar220,(undefined1  [16])aVar2,auVar43);
  auVar52 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar1,auVar186);
  local_2e0 = vsubps_avx512vl(_local_370,auVar55);
  uVar112 = local_2e0._0_4_;
  auVar187._4_4_ = uVar112;
  auVar187._0_4_ = uVar112;
  auVar187._8_4_ = uVar112;
  auVar187._12_4_ = uVar112;
  auVar43 = vshufps_avx(local_2e0,local_2e0,0x55);
  auVar44 = vshufps_avx(local_2e0,local_2e0,0xaa);
  auVar227._0_4_ = auVar44._0_4_ * fVar219;
  auVar227._4_4_ = auVar44._4_4_ * fVar202;
  auVar227._8_4_ = auVar44._8_4_ * fVar214;
  auVar227._12_4_ = auVar44._12_4_ * fVar215;
  auVar43 = vfmadd231ps_fma(auVar227,(undefined1  [16])aVar2,auVar43);
  auVar53 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar1,auVar187);
  local_2f0 = vsubps_avx512vl(_local_330,auVar55);
  uVar112 = local_2f0._0_4_;
  auVar110._4_4_ = uVar112;
  auVar110._0_4_ = uVar112;
  auVar110._8_4_ = uVar112;
  auVar110._12_4_ = uVar112;
  auVar43 = vshufps_avx(local_2f0,local_2f0,0x55);
  auVar44 = vshufps_avx(local_2f0,local_2f0,0xaa);
  auVar172._0_4_ = auVar44._0_4_ * fVar219;
  auVar172._4_4_ = auVar44._4_4_ * fVar202;
  auVar172._8_4_ = auVar44._8_4_ * fVar214;
  auVar172._12_4_ = auVar44._12_4_ * fVar215;
  auVar43 = vfmadd231ps_fma(auVar172,(undefined1  [16])aVar2,auVar43);
  auVar54 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar1,auVar110);
  auVar45 = vmovlhps_avx(auVar48,auVar46);
  auVar18 = vmovlhps_avx(auVar47,auVar52);
  auVar51 = vmovlhps_avx512f(auVar49,auVar53);
  _local_420 = vmovlhps_avx512f(auVar50,auVar54);
  auVar44 = vminps_avx(auVar45,auVar18);
  auVar43 = vmaxps_avx(auVar45,auVar18);
  auVar55 = vminps_avx512vl(auVar51,_local_420);
  auVar44 = vminps_avx(auVar44,auVar55);
  auVar55 = vmaxps_avx512vl(auVar51,_local_420);
  auVar43 = vmaxps_avx(auVar43,auVar55);
  auVar55 = vshufpd_avx(auVar44,auVar44,3);
  auVar44 = vminps_avx(auVar44,auVar55);
  auVar55 = vshufpd_avx(auVar43,auVar43,3);
  auVar43 = vmaxps_avx(auVar43,auVar55);
  auVar44 = vandps_avx512vl(auVar44,auVar258._0_16_);
  auVar43 = vandps_avx512vl(auVar43,auVar258._0_16_);
  auVar43 = vmaxps_avx(auVar44,auVar43);
  auVar44 = vmovshdup_avx(auVar43);
  auVar43 = vmaxss_avx(auVar44,auVar43);
  local_400 = vmovddup_avx512vl(auVar48);
  local_410 = vmovddup_avx512vl(auVar47);
  auVar115._8_8_ = auVar49._0_8_;
  auVar115._0_8_ = auVar49._0_8_;
  auVar165._0_8_ = auVar50._0_8_;
  auVar165._8_8_ = auVar165._0_8_;
  local_430 = ZEXT416((uint)(auVar43._0_4_ * 9.536743e-07));
  local_1c0 = vbroadcastss_avx512vl(local_430);
  auVar43 = vxorps_avx512vl(local_1c0._0_16_,auVar256._0_16_);
  local_1e0 = vbroadcastss_avx512vl(auVar43);
  uVar36 = 0;
  auVar43 = vsubps_avx(auVar18,auVar45);
  auVar55 = vsubps_avx512vl(auVar51,auVar18);
  local_270 = vsubps_avx512vl(_local_420,auVar51);
  local_380 = vsubps_avx(_local_310,local_300);
  local_390 = vsubps_avx512vl(_local_360,local_340);
  local_3a0 = vsubps_avx512vl(_local_370,local_350);
  _local_3b0 = vsubps_avx512vl(_local_330,local_320);
  local_200 = vpbroadcastd_avx512vl();
  local_220 = vpbroadcastd_avx512vl();
  auVar44 = ZEXT816(0x3f80000000000000);
  auVar245 = ZEXT1664(auVar44);
  do {
    auVar57 = auVar245._0_16_;
    auVar48 = vshufps_avx(auVar57,auVar57,0x50);
    auVar241._8_4_ = 0x3f800000;
    auVar241._0_8_ = &DAT_3f8000003f800000;
    auVar241._12_4_ = 0x3f800000;
    auVar143._16_4_ = 0x3f800000;
    auVar143._0_16_ = auVar241;
    auVar143._20_4_ = 0x3f800000;
    auVar143._24_4_ = 0x3f800000;
    auVar143._28_4_ = 0x3f800000;
    auVar47 = vsubps_avx(auVar241,auVar48);
    fVar219 = auVar48._0_4_;
    fVar181 = auVar46._0_4_;
    auVar136._0_4_ = fVar181 * fVar219;
    fVar202 = auVar48._4_4_;
    fVar182 = auVar46._4_4_;
    auVar136._4_4_ = fVar182 * fVar202;
    fVar214 = auVar48._8_4_;
    auVar136._8_4_ = fVar181 * fVar214;
    fVar215 = auVar48._12_4_;
    auVar136._12_4_ = fVar182 * fVar215;
    fVar123 = auVar52._0_4_;
    auVar146._0_4_ = fVar123 * fVar219;
    fVar124 = auVar52._4_4_;
    auVar146._4_4_ = fVar124 * fVar202;
    auVar146._8_4_ = fVar123 * fVar214;
    auVar146._12_4_ = fVar124 * fVar215;
    fVar125 = auVar53._0_4_;
    auVar153._0_4_ = fVar125 * fVar219;
    fVar226 = auVar53._4_4_;
    auVar153._4_4_ = fVar226 * fVar202;
    auVar153._8_4_ = fVar125 * fVar214;
    auVar153._12_4_ = fVar226 * fVar215;
    fVar235 = auVar54._0_4_;
    auVar116._0_4_ = fVar235 * fVar219;
    fVar236 = auVar54._4_4_;
    auVar116._4_4_ = fVar236 * fVar202;
    auVar116._8_4_ = fVar235 * fVar214;
    auVar116._12_4_ = fVar236 * fVar215;
    auVar49 = vfmadd231ps_avx512vl(auVar136,auVar47,local_400);
    auVar50 = vfmadd231ps_avx512vl(auVar146,auVar47,local_410);
    auVar73._16_16_ = vfmadd231ps_avx512vl(auVar153,auVar47,auVar115);
    auVar47 = vfmadd231ps_fma(auVar116,auVar165,auVar47);
    auVar48 = vmovshdup_avx(auVar44);
    fVar202 = auVar44._0_4_;
    fVar219 = (auVar48._0_4_ - fVar202) * 0.04761905;
    auVar83._4_4_ = fVar202;
    auVar83._0_4_ = fVar202;
    auVar83._8_4_ = fVar202;
    auVar83._12_4_ = fVar202;
    auVar83._16_4_ = fVar202;
    auVar83._20_4_ = fVar202;
    auVar83._24_4_ = fVar202;
    auVar83._28_4_ = fVar202;
    auVar78._0_8_ = auVar48._0_8_;
    auVar78._8_8_ = auVar78._0_8_;
    auVar78._16_8_ = auVar78._0_8_;
    auVar78._24_8_ = auVar78._0_8_;
    auVar87 = vsubps_avx(auVar78,auVar83);
    uVar112 = auVar49._0_4_;
    auVar89._4_4_ = uVar112;
    auVar89._0_4_ = uVar112;
    auVar89._8_4_ = uVar112;
    auVar89._12_4_ = uVar112;
    auVar89._16_4_ = uVar112;
    auVar89._20_4_ = uVar112;
    auVar89._24_4_ = uVar112;
    auVar89._28_4_ = uVar112;
    auVar79._8_4_ = 1;
    auVar79._0_8_ = 0x100000001;
    auVar79._12_4_ = 1;
    auVar79._16_4_ = 1;
    auVar79._20_4_ = 1;
    auVar79._24_4_ = 1;
    auVar79._28_4_ = 1;
    auVar85 = ZEXT1632(auVar49);
    auVar84 = vpermps_avx2(auVar79,auVar85);
    auVar70 = vbroadcastss_avx512vl(auVar50);
    auVar86 = ZEXT1632(auVar50);
    auVar71 = vpermps_avx512vl(auVar79,auVar86);
    auVar72 = vbroadcastss_avx512vl(auVar73._16_16_);
    auVar80 = ZEXT1632(auVar73._16_16_);
    auVar73 = vpermps_avx512vl(auVar79,auVar80);
    auVar74 = vbroadcastss_avx512vl(auVar47);
    auVar82 = ZEXT1632(auVar47);
    auVar75 = vpermps_avx512vl(auVar79,auVar82);
    auVar90._4_4_ = fVar219;
    auVar90._0_4_ = fVar219;
    auVar90._8_4_ = fVar219;
    auVar90._12_4_ = fVar219;
    auVar90._16_4_ = fVar219;
    auVar90._20_4_ = fVar219;
    auVar90._24_4_ = fVar219;
    auVar90._28_4_ = fVar219;
    auVar81._8_4_ = 2;
    auVar81._0_8_ = 0x200000002;
    auVar81._12_4_ = 2;
    auVar81._16_4_ = 2;
    auVar81._20_4_ = 2;
    auVar81._24_4_ = 2;
    auVar81._28_4_ = 2;
    auVar76 = vpermps_avx512vl(auVar81,auVar85);
    auVar77 = vbroadcastss_avx512vl(ZEXT416(3));
    auVar78 = vpermps_avx512vl(auVar77,auVar85);
    auVar85 = vpermps_avx2(auVar81,auVar86);
    auVar79 = vpermps_avx512vl(auVar77,auVar86);
    auVar86 = vpermps_avx2(auVar81,auVar80);
    auVar80 = vpermps_avx512vl(auVar77,auVar80);
    auVar81 = vpermps_avx512vl(auVar81,auVar82);
    auVar77 = vpermps_avx512vl(auVar77,auVar82);
    auVar48 = vfmadd132ps_fma(auVar87,auVar83,_DAT_02020f20);
    auVar87 = vsubps_avx(auVar143,ZEXT1632(auVar48));
    auVar82 = vmulps_avx512vl(auVar70,ZEXT1632(auVar48));
    auVar88 = ZEXT1632(auVar48);
    auVar83 = vmulps_avx512vl(auVar71,auVar88);
    auVar47 = vfmadd231ps_fma(auVar82,auVar87,auVar89);
    auVar49 = vfmadd231ps_fma(auVar83,auVar87,auVar84);
    auVar82 = vmulps_avx512vl(auVar72,auVar88);
    auVar83 = vmulps_avx512vl(auVar73,auVar88);
    auVar82 = vfmadd231ps_avx512vl(auVar82,auVar87,auVar70);
    auVar83 = vfmadd231ps_avx512vl(auVar83,auVar87,auVar71);
    auVar70 = vmulps_avx512vl(auVar74,auVar88);
    auVar89 = ZEXT1632(auVar48);
    auVar71 = vmulps_avx512vl(auVar75,auVar89);
    auVar75 = vfmadd231ps_avx512vl(auVar70,auVar87,auVar72);
    auVar73 = vfmadd231ps_avx512vl(auVar71,auVar87,auVar73);
    fVar214 = auVar48._0_4_;
    fVar215 = auVar48._4_4_;
    auVar70._4_4_ = fVar215 * auVar82._4_4_;
    auVar70._0_4_ = fVar214 * auVar82._0_4_;
    fVar216 = auVar48._8_4_;
    auVar70._8_4_ = fVar216 * auVar82._8_4_;
    fVar217 = auVar48._12_4_;
    auVar70._12_4_ = fVar217 * auVar82._12_4_;
    auVar70._16_4_ = auVar82._16_4_ * 0.0;
    auVar70._20_4_ = auVar82._20_4_ * 0.0;
    auVar70._24_4_ = auVar82._24_4_ * 0.0;
    auVar70._28_4_ = fVar202;
    auVar71._4_4_ = fVar215 * auVar83._4_4_;
    auVar71._0_4_ = fVar214 * auVar83._0_4_;
    auVar71._8_4_ = fVar216 * auVar83._8_4_;
    auVar71._12_4_ = fVar217 * auVar83._12_4_;
    auVar71._16_4_ = auVar83._16_4_ * 0.0;
    auVar71._20_4_ = auVar83._20_4_ * 0.0;
    auVar71._24_4_ = auVar83._24_4_ * 0.0;
    auVar71._28_4_ = auVar84._28_4_;
    auVar47 = vfmadd231ps_fma(auVar70,auVar87,ZEXT1632(auVar47));
    auVar49 = vfmadd231ps_fma(auVar71,auVar87,ZEXT1632(auVar49));
    auVar88._0_4_ = fVar214 * auVar75._0_4_;
    auVar88._4_4_ = fVar215 * auVar75._4_4_;
    auVar88._8_4_ = fVar216 * auVar75._8_4_;
    auVar88._12_4_ = fVar217 * auVar75._12_4_;
    auVar88._16_4_ = auVar75._16_4_ * 0.0;
    auVar88._20_4_ = auVar75._20_4_ * 0.0;
    auVar88._24_4_ = auVar75._24_4_ * 0.0;
    auVar88._28_4_ = 0;
    auVar72._4_4_ = fVar215 * auVar73._4_4_;
    auVar72._0_4_ = fVar214 * auVar73._0_4_;
    auVar72._8_4_ = fVar216 * auVar73._8_4_;
    auVar72._12_4_ = fVar217 * auVar73._12_4_;
    auVar72._16_4_ = auVar73._16_4_ * 0.0;
    auVar72._20_4_ = auVar73._20_4_ * 0.0;
    auVar72._24_4_ = auVar73._24_4_ * 0.0;
    auVar72._28_4_ = auVar75._28_4_;
    auVar50 = vfmadd231ps_fma(auVar88,auVar87,auVar82);
    auVar73._16_16_ = vfmadd231ps_fma(auVar72,auVar87,auVar83);
    auVar75._28_4_ = auVar83._28_4_;
    auVar75._0_28_ =
         ZEXT1628(CONCAT412(fVar217 * auVar73._28_4_,
                            CONCAT48(fVar216 * auVar73._24_4_,
                                     CONCAT44(fVar215 * auVar73._20_4_,fVar214 * auVar73._16_4_))));
    auVar56 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar217 * auVar50._12_4_,
                                                 CONCAT48(fVar216 * auVar50._8_4_,
                                                          CONCAT44(fVar215 * auVar50._4_4_,
                                                                   fVar214 * auVar50._0_4_)))),
                              auVar87,ZEXT1632(auVar47));
    auVar64 = vfmadd231ps_fma(auVar75,auVar87,ZEXT1632(auVar49));
    auVar84 = vsubps_avx(ZEXT1632(auVar50),ZEXT1632(auVar47));
    auVar73 = vsubps_avx(ZEXT1632(auVar73._16_16_),ZEXT1632(auVar49));
    auVar70 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar84 = vmulps_avx512vl(auVar84,auVar70);
    auVar73 = vmulps_avx512vl(auVar73,auVar70);
    auVar82._0_4_ = fVar219 * auVar84._0_4_;
    auVar82._4_4_ = fVar219 * auVar84._4_4_;
    auVar82._8_4_ = fVar219 * auVar84._8_4_;
    auVar82._12_4_ = fVar219 * auVar84._12_4_;
    auVar82._16_4_ = fVar219 * auVar84._16_4_;
    auVar82._20_4_ = fVar219 * auVar84._20_4_;
    auVar82._24_4_ = fVar219 * auVar84._24_4_;
    auVar82._28_4_ = 0;
    auVar73 = vmulps_avx512vl(auVar90,auVar73);
    auVar50 = vxorps_avx512vl(auVar74._0_16_,auVar74._0_16_);
    auVar84 = vpermt2ps_avx512vl(ZEXT1632(auVar56),_DAT_0205fd20,ZEXT1632(auVar50));
    auVar71 = vpermt2ps_avx512vl(ZEXT1632(auVar64),_DAT_0205fd20,ZEXT1632(auVar50));
    auVar122._0_4_ = auVar82._0_4_ + auVar56._0_4_;
    auVar122._4_4_ = auVar82._4_4_ + auVar56._4_4_;
    auVar122._8_4_ = auVar82._8_4_ + auVar56._8_4_;
    auVar122._12_4_ = auVar82._12_4_ + auVar56._12_4_;
    auVar122._16_4_ = auVar82._16_4_ + 0.0;
    auVar122._20_4_ = auVar82._20_4_ + 0.0;
    auVar122._24_4_ = auVar82._24_4_ + 0.0;
    auVar122._28_4_ = 0;
    auVar83 = ZEXT1632(auVar50);
    auVar72 = vpermt2ps_avx512vl(auVar82,_DAT_0205fd20,auVar83);
    auVar75 = vaddps_avx512vl(ZEXT1632(auVar64),auVar73);
    auVar74 = vpermt2ps_avx512vl(auVar73,_DAT_0205fd20,auVar83);
    auVar73 = vsubps_avx(auVar84,auVar72);
    auVar72 = vsubps_avx512vl(auVar71,auVar74);
    auVar74 = vmulps_avx512vl(auVar85,auVar89);
    auVar82 = vmulps_avx512vl(auVar79,auVar89);
    auVar74 = vfmadd231ps_avx512vl(auVar74,auVar87,auVar76);
    auVar76 = vfmadd231ps_avx512vl(auVar82,auVar87,auVar78);
    auVar78 = vmulps_avx512vl(auVar86,auVar89);
    auVar82 = vmulps_avx512vl(auVar80,auVar89);
    auVar85 = vfmadd231ps_avx512vl(auVar78,auVar87,auVar85);
    auVar78 = vfmadd231ps_avx512vl(auVar82,auVar87,auVar79);
    auVar79 = vmulps_avx512vl(auVar81,auVar89);
    auVar77 = vmulps_avx512vl(auVar77,auVar89);
    auVar47 = vfmadd231ps_fma(auVar79,auVar87,auVar86);
    auVar49 = vfmadd231ps_fma(auVar77,auVar87,auVar80);
    auVar77 = vmulps_avx512vl(auVar89,auVar85);
    auVar79 = vmulps_avx512vl(ZEXT1632(auVar48),auVar78);
    auVar77 = vfmadd231ps_avx512vl(auVar77,auVar87,auVar74);
    auVar79 = vfmadd231ps_avx512vl(auVar79,auVar87,auVar76);
    auVar85 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar217 * auVar47._12_4_,
                                            CONCAT48(fVar216 * auVar47._8_4_,
                                                     CONCAT44(fVar215 * auVar47._4_4_,
                                                              fVar214 * auVar47._0_4_)))),auVar87,
                         auVar85);
    auVar78 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar217 * auVar49._12_4_,
                                            CONCAT48(fVar216 * auVar49._8_4_,
                                                     CONCAT44(fVar215 * auVar49._4_4_,
                                                              fVar214 * auVar49._0_4_)))),auVar87,
                         auVar78);
    auVar74._4_4_ = fVar215 * auVar85._4_4_;
    auVar74._0_4_ = fVar214 * auVar85._0_4_;
    auVar74._8_4_ = fVar216 * auVar85._8_4_;
    auVar74._12_4_ = fVar217 * auVar85._12_4_;
    auVar74._16_4_ = auVar85._16_4_ * 0.0;
    auVar74._20_4_ = auVar85._20_4_ * 0.0;
    auVar74._24_4_ = auVar85._24_4_ * 0.0;
    auVar74._28_4_ = auVar80._28_4_;
    auVar76._4_4_ = fVar215 * auVar78._4_4_;
    auVar76._0_4_ = fVar214 * auVar78._0_4_;
    auVar76._8_4_ = fVar216 * auVar78._8_4_;
    auVar76._12_4_ = fVar217 * auVar78._12_4_;
    auVar76._16_4_ = auVar78._16_4_ * 0.0;
    auVar76._20_4_ = auVar78._20_4_ * 0.0;
    auVar76._24_4_ = auVar78._24_4_ * 0.0;
    auVar76._28_4_ = auVar86._28_4_;
    auVar86 = vfmadd231ps_avx512vl(auVar74,auVar87,auVar77);
    auVar74 = vfmadd231ps_avx512vl(auVar76,auVar79,auVar87);
    auVar87 = vsubps_avx512vl(auVar85,auVar77);
    auVar85 = vsubps_avx512vl(auVar78,auVar79);
    auVar87 = vmulps_avx512vl(auVar87,auVar70);
    auVar85 = vmulps_avx512vl(auVar85,auVar70);
    fVar202 = fVar219 * auVar87._0_4_;
    fVar214 = fVar219 * auVar87._4_4_;
    auVar77._4_4_ = fVar214;
    auVar77._0_4_ = fVar202;
    fVar215 = fVar219 * auVar87._8_4_;
    auVar77._8_4_ = fVar215;
    fVar216 = fVar219 * auVar87._12_4_;
    auVar77._12_4_ = fVar216;
    fVar217 = fVar219 * auVar87._16_4_;
    auVar77._16_4_ = fVar217;
    fVar218 = fVar219 * auVar87._20_4_;
    auVar77._20_4_ = fVar218;
    fVar219 = fVar219 * auVar87._24_4_;
    auVar77._24_4_ = fVar219;
    auVar77._28_4_ = auVar87._28_4_;
    auVar85 = vmulps_avx512vl(auVar90,auVar85);
    auVar70 = vpermt2ps_avx512vl(auVar86,_DAT_0205fd20,auVar83);
    auVar76 = vpermt2ps_avx512vl(auVar74,_DAT_0205fd20,auVar83);
    auVar201._0_4_ = auVar86._0_4_ + fVar202;
    auVar201._4_4_ = auVar86._4_4_ + fVar214;
    auVar201._8_4_ = auVar86._8_4_ + fVar215;
    auVar201._12_4_ = auVar86._12_4_ + fVar216;
    auVar201._16_4_ = auVar86._16_4_ + fVar217;
    auVar201._20_4_ = auVar86._20_4_ + fVar218;
    auVar201._24_4_ = auVar86._24_4_ + fVar219;
    auVar201._28_4_ = auVar86._28_4_ + auVar87._28_4_;
    auVar87 = vpermt2ps_avx512vl(auVar77,_DAT_0205fd20,ZEXT1632(auVar50));
    auVar77 = vaddps_avx512vl(auVar74,auVar85);
    auVar85 = vpermt2ps_avx512vl(auVar85,_DAT_0205fd20,ZEXT1632(auVar50));
    auVar87 = vsubps_avx(auVar70,auVar87);
    auVar85 = vsubps_avx512vl(auVar76,auVar85);
    auVar143 = ZEXT1632(auVar56);
    auVar78 = vsubps_avx512vl(auVar86,auVar143);
    auVar144 = ZEXT1632(auVar64);
    auVar79 = vsubps_avx512vl(auVar74,auVar144);
    auVar80 = vsubps_avx512vl(auVar70,auVar84);
    auVar78 = vaddps_avx512vl(auVar78,auVar80);
    auVar80 = vsubps_avx512vl(auVar76,auVar71);
    auVar79 = vaddps_avx512vl(auVar79,auVar80);
    auVar80 = vmulps_avx512vl(auVar144,auVar78);
    auVar80 = vfnmadd231ps_avx512vl(auVar80,auVar143,auVar79);
    auVar81 = vmulps_avx512vl(auVar75,auVar78);
    auVar81 = vfnmadd231ps_avx512vl(auVar81,auVar122,auVar79);
    auVar82 = vmulps_avx512vl(auVar72,auVar78);
    auVar82 = vfnmadd231ps_avx512vl(auVar82,auVar73,auVar79);
    auVar83 = vmulps_avx512vl(auVar71,auVar78);
    auVar83 = vfnmadd231ps_avx512vl(auVar83,auVar84,auVar79);
    auVar88 = vmulps_avx512vl(auVar74,auVar78);
    auVar88 = vfnmadd231ps_avx512vl(auVar88,auVar86,auVar79);
    auVar89 = vmulps_avx512vl(auVar77,auVar78);
    auVar89 = vfnmadd231ps_avx512vl(auVar89,auVar201,auVar79);
    auVar90 = vmulps_avx512vl(auVar85,auVar78);
    auVar90 = vfnmadd231ps_avx512vl(auVar90,auVar87,auVar79);
    auVar78 = vmulps_avx512vl(auVar76,auVar78);
    auVar78 = vfnmadd231ps_avx512vl(auVar78,auVar70,auVar79);
    auVar79 = vminps_avx512vl(auVar80,auVar81);
    auVar80 = vmaxps_avx512vl(auVar80,auVar81);
    auVar81 = vminps_avx512vl(auVar82,auVar83);
    auVar79 = vminps_avx512vl(auVar79,auVar81);
    auVar81 = vmaxps_avx512vl(auVar82,auVar83);
    auVar80 = vmaxps_avx512vl(auVar80,auVar81);
    auVar81 = vminps_avx512vl(auVar88,auVar89);
    auVar82 = vmaxps_avx512vl(auVar88,auVar89);
    auVar83 = vminps_avx512vl(auVar90,auVar78);
    auVar81 = vminps_avx512vl(auVar81,auVar83);
    auVar79 = vminps_avx512vl(auVar79,auVar81);
    auVar78 = vmaxps_avx512vl(auVar90,auVar78);
    auVar78 = vmaxps_avx512vl(auVar82,auVar78);
    auVar78 = vmaxps_avx512vl(auVar80,auVar78);
    uVar19 = vcmpps_avx512vl(auVar79,local_1c0,2);
    uVar20 = vcmpps_avx512vl(auVar78,local_1e0,5);
    uVar107 = 0;
    bVar34 = (byte)uVar19 & (byte)uVar20 & 0x7f;
    if (bVar34 != 0) {
      auVar78 = vsubps_avx512vl(auVar84,auVar143);
      auVar79 = vsubps_avx512vl(auVar71,auVar144);
      auVar80 = vsubps_avx512vl(auVar70,auVar86);
      auVar78 = vaddps_avx512vl(auVar78,auVar80);
      auVar80 = vsubps_avx512vl(auVar76,auVar74);
      auVar79 = vaddps_avx512vl(auVar79,auVar80);
      auVar80 = vmulps_avx512vl(auVar144,auVar78);
      auVar80 = vfnmadd231ps_avx512vl(auVar80,auVar79,auVar143);
      auVar75 = vmulps_avx512vl(auVar75,auVar78);
      auVar75 = vfnmadd213ps_avx512vl(auVar122,auVar79,auVar75);
      auVar72 = vmulps_avx512vl(auVar72,auVar78);
      auVar72 = vfnmadd213ps_avx512vl(auVar73,auVar79,auVar72);
      auVar73 = vmulps_avx512vl(auVar71,auVar78);
      auVar71 = vfnmadd231ps_avx512vl(auVar73,auVar79,auVar84);
      auVar73 = vmulps_avx512vl(auVar74,auVar78);
      auVar86 = vfnmadd231ps_avx512vl(auVar73,auVar79,auVar86);
      auVar73 = vmulps_avx512vl(auVar77,auVar78);
      auVar74 = vfnmadd213ps_avx512vl(auVar201,auVar79,auVar73);
      auVar73 = vmulps_avx512vl(auVar85,auVar78);
      auVar77 = vfnmadd213ps_avx512vl(auVar87,auVar79,auVar73);
      auVar73 = vmulps_avx512vl(auVar76,auVar78);
      auVar70 = vfnmadd231ps_avx512vl(auVar73,auVar70,auVar79);
      auVar87 = vminps_avx(auVar80,auVar75);
      auVar73 = vmaxps_avx(auVar80,auVar75);
      auVar84 = vminps_avx(auVar72,auVar71);
      auVar84 = vminps_avx(auVar87,auVar84);
      auVar87 = vmaxps_avx(auVar72,auVar71);
      auVar73 = vmaxps_avx(auVar73,auVar87);
      auVar85 = vminps_avx(auVar86,auVar74);
      auVar87 = vmaxps_avx(auVar86,auVar74);
      auVar86 = vminps_avx(auVar77,auVar70);
      auVar85 = vminps_avx(auVar85,auVar86);
      auVar85 = vminps_avx(auVar84,auVar85);
      auVar84 = vmaxps_avx(auVar77,auVar70);
      auVar87 = vmaxps_avx(auVar87,auVar84);
      auVar73 = vmaxps_avx(auVar73,auVar87);
      uVar19 = vcmpps_avx512vl(auVar73,local_1e0,5);
      uVar20 = vcmpps_avx512vl(auVar85,local_1c0,2);
      uVar107 = (uint)(bVar34 & (byte)uVar19 & (byte)uVar20);
    }
    if (uVar107 != 0) {
      auStack_3f0[uVar36] = uVar107;
      uVar19 = vmovlps_avx(auVar44);
      *(undefined8 *)(&uStack_260 + uVar36 * 2) = uVar19;
      uVar39 = vmovlps_avx512f(auVar57);
      auStack_1a0[uVar36] = uVar39;
      uVar36 = (ulong)((int)uVar36 + 1);
    }
    auVar44 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar255 = ZEXT1664(auVar44);
    auVar44 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar256 = ZEXT1664(auVar44);
    auVar73 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    in_ZMM19 = ZEXT3264(auVar73);
    auVar257 = ZEXT464(0x3f800000);
    do {
      if ((int)uVar36 == 0) {
        uVar112 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar22._4_4_ = uVar112;
        auVar22._0_4_ = uVar112;
        auVar22._8_4_ = uVar112;
        auVar22._12_4_ = uVar112;
        uVar19 = vcmpps_avx512vl(local_3c0,auVar22,2);
        uVar41 = (uint)uVar42 & (uint)uVar42 + 0xf & (uint)uVar19;
        uVar42 = (ulong)uVar41;
        if (uVar41 == 0) {
          return;
        }
        goto LAB_01b3ee86;
      }
      uVar35 = (int)uVar36 - 1;
      uVar37 = (ulong)uVar35;
      uVar107 = (&uStack_260)[uVar37 * 2];
      fVar219 = afStack_25c[uVar37 * 2];
      uVar5 = auStack_3f0[uVar37];
      auVar242._8_8_ = 0;
      auVar242._0_8_ = auStack_1a0[uVar37];
      auVar245 = ZEXT1664(auVar242);
      lVar40 = 0;
      for (uVar39 = (ulong)uVar5; (uVar39 & 1) == 0; uVar39 = uVar39 >> 1 | 0x8000000000000000) {
        lVar40 = lVar40 + 1;
      }
      uVar38 = uVar5 - 1 & uVar5;
      auStack_3f0[uVar37] = uVar38;
      if (uVar38 == 0) {
        uVar36 = (ulong)uVar35;
      }
      auVar131._0_4_ = (float)lVar40;
      auVar131._4_8_ = SUB128(ZEXT812(0),4);
      auVar131._12_4_ = 0;
      auVar44 = vmulss_avx512f(auVar131,SUB6416(ZEXT464(0x3e124925),0));
      lVar40 = lVar40 + 1;
      auVar48 = vmulss_avx512f(ZEXT416((uint)(float)lVar40),SUB6416(ZEXT464(0x3e124925),0));
      auVar49 = auVar257._0_16_;
      auVar47 = vsubss_avx512f(auVar49,auVar44);
      auVar44 = vmulss_avx512f(ZEXT416((uint)fVar219),auVar44);
      auVar47 = vfmadd231ss_avx512f(auVar44,ZEXT416(uVar107),auVar47);
      auVar44 = vsubss_avx512f(auVar49,auVar48);
      auVar44 = vfmadd231ss_fma(ZEXT416((uint)(fVar219 * auVar48._0_4_)),ZEXT416(uVar107),auVar44);
      auVar48 = vsubss_avx512f(auVar44,auVar47);
      vucomiss_avx512f(auVar48);
      if (uVar5 == 0 || lVar40 == 0) break;
      auVar50 = vshufps_avx(auVar242,auVar242,0x50);
      vucomiss_avx512f(auVar48);
      auVar239 = auVar259._0_16_;
      auVar56 = vsubps_avx512vl(auVar239,auVar50);
      fVar219 = auVar50._0_4_;
      auVar137._0_4_ = fVar181 * fVar219;
      fVar202 = auVar50._4_4_;
      auVar137._4_4_ = fVar182 * fVar202;
      fVar214 = auVar50._8_4_;
      auVar137._8_4_ = fVar181 * fVar214;
      fVar215 = auVar50._12_4_;
      auVar137._12_4_ = fVar182 * fVar215;
      auVar147._0_4_ = fVar123 * fVar219;
      auVar147._4_4_ = fVar124 * fVar202;
      auVar147._8_4_ = fVar123 * fVar214;
      auVar147._12_4_ = fVar124 * fVar215;
      auVar154._0_4_ = fVar125 * fVar219;
      auVar154._4_4_ = fVar226 * fVar202;
      auVar154._8_4_ = fVar125 * fVar214;
      auVar154._12_4_ = fVar226 * fVar215;
      auVar117._0_4_ = fVar235 * fVar219;
      auVar117._4_4_ = fVar236 * fVar202;
      auVar117._8_4_ = fVar235 * fVar214;
      auVar117._12_4_ = fVar236 * fVar215;
      auVar50 = vfmadd231ps_fma(auVar137,auVar56,local_400);
      auVar73._16_16_ = vfmadd231ps_fma(auVar147,auVar56,local_410);
      auVar57 = vfmadd231ps_avx512vl(auVar154,auVar56,auVar115);
      auVar56 = vfmadd231ps_fma(auVar117,auVar165,auVar56);
      auVar80._16_16_ = auVar50;
      auVar80._0_16_ = auVar50;
      auVar144._16_16_ = auVar73._16_16_;
      auVar144._0_16_ = auVar73._16_16_;
      auVar150._16_16_ = auVar57;
      auVar150._0_16_ = auVar57;
      uVar112 = auVar47._0_4_;
      auVar169._4_4_ = uVar112;
      auVar169._0_4_ = uVar112;
      auVar169._8_4_ = uVar112;
      auVar169._12_4_ = uVar112;
      uVar112 = auVar44._0_4_;
      auVar169._20_4_ = uVar112;
      auVar169._16_4_ = uVar112;
      auVar169._24_4_ = uVar112;
      auVar169._28_4_ = uVar112;
      auVar73 = vsubps_avx(auVar144,auVar80);
      auVar73._16_16_ = vfmadd213ps_fma(auVar73,auVar169,auVar80);
      auVar87 = vsubps_avx(auVar150,auVar144);
      auVar64 = vfmadd213ps_fma(auVar87,auVar169,auVar144);
      auVar50 = vsubps_avx(auVar56,auVar57);
      auVar145._16_16_ = auVar50;
      auVar145._0_16_ = auVar50;
      auVar50 = vfmadd213ps_fma(auVar145,auVar169,auVar150);
      auVar87 = vsubps_avx(ZEXT1632(auVar64),ZEXT1632(auVar73._16_16_));
      auVar73._16_16_ = vfmadd213ps_fma(auVar87,auVar169,ZEXT1632(auVar73._16_16_));
      auVar87 = vsubps_avx(ZEXT1632(auVar50),ZEXT1632(auVar64));
      auVar50 = vfmadd213ps_fma(auVar87,auVar169,ZEXT1632(auVar64));
      auVar87 = vsubps_avx(ZEXT1632(auVar50),ZEXT1632(auVar73._16_16_));
      auVar62 = vfmadd231ps_fma(ZEXT1632(auVar73._16_16_),auVar87,auVar169);
      auVar73 = vmulps_avx512vl(auVar87,in_ZMM19._0_32_);
      auVar50 = vmulss_avx512f(auVar48,SUB6416(ZEXT464(0x3eaaaaab),0));
      fVar219 = auVar50._0_4_;
      auVar155._0_8_ =
           CONCAT44(auVar62._4_4_ + fVar219 * auVar73._4_4_,auVar62._0_4_ + fVar219 * auVar73._0_4_)
      ;
      auVar155._8_4_ = auVar62._8_4_ + fVar219 * auVar73._8_4_;
      auVar155._12_4_ = auVar62._12_4_ + fVar219 * auVar73._12_4_;
      auVar138._0_4_ = fVar219 * auVar73._16_4_;
      auVar138._4_4_ = fVar219 * auVar73._20_4_;
      auVar138._8_4_ = fVar219 * auVar73._24_4_;
      auVar138._12_4_ = fVar219 * auVar73._28_4_;
      auVar69 = vsubps_avx((undefined1  [16])0x0,auVar138);
      auVar67 = vshufpd_avx(auVar62,auVar62,3);
      auVar63 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar50 = vsubps_avx(auVar67,auVar62);
      auVar56 = vsubps_avx(auVar63,(undefined1  [16])0x0);
      auVar173._0_4_ = auVar56._0_4_ + auVar50._0_4_;
      auVar173._4_4_ = auVar56._4_4_ + auVar50._4_4_;
      auVar173._8_4_ = auVar56._8_4_ + auVar50._8_4_;
      auVar173._12_4_ = auVar56._12_4_ + auVar50._12_4_;
      auVar50 = vshufps_avx(auVar62,auVar62,0xb1);
      auVar56 = vshufps_avx(auVar155,auVar155,0xb1);
      auVar64 = vshufps_avx(auVar69,auVar69,0xb1);
      auVar57 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar228._4_4_ = auVar173._0_4_;
      auVar228._0_4_ = auVar173._0_4_;
      auVar228._8_4_ = auVar173._0_4_;
      auVar228._12_4_ = auVar173._0_4_;
      auVar65 = vshufps_avx(auVar173,auVar173,0x55);
      fVar219 = auVar65._0_4_;
      auVar188._0_4_ = auVar50._0_4_ * fVar219;
      fVar202 = auVar65._4_4_;
      auVar188._4_4_ = auVar50._4_4_ * fVar202;
      fVar214 = auVar65._8_4_;
      auVar188._8_4_ = auVar50._8_4_ * fVar214;
      fVar215 = auVar65._12_4_;
      auVar188._12_4_ = auVar50._12_4_ * fVar215;
      auVar199._0_4_ = auVar56._0_4_ * fVar219;
      auVar199._4_4_ = auVar56._4_4_ * fVar202;
      auVar199._8_4_ = auVar56._8_4_ * fVar214;
      auVar199._12_4_ = auVar56._12_4_ * fVar215;
      auVar206._0_4_ = auVar64._0_4_ * fVar219;
      auVar206._4_4_ = auVar64._4_4_ * fVar202;
      auVar206._8_4_ = auVar64._8_4_ * fVar214;
      auVar206._12_4_ = auVar64._12_4_ * fVar215;
      auVar174._0_4_ = auVar57._0_4_ * fVar219;
      auVar174._4_4_ = auVar57._4_4_ * fVar202;
      auVar174._8_4_ = auVar57._8_4_ * fVar214;
      auVar174._12_4_ = auVar57._12_4_ * fVar215;
      auVar50 = vfmadd231ps_fma(auVar188,auVar228,auVar62);
      auVar56 = vfmadd231ps_fma(auVar199,auVar228,auVar155);
      auVar65 = vfmadd231ps_fma(auVar206,auVar228,auVar69);
      auVar61 = vfmadd231ps_fma(auVar174,(undefined1  [16])0x0,auVar228);
      auVar66 = vshufpd_avx(auVar50,auVar50,1);
      auVar58 = vshufpd_avx(auVar56,auVar56,1);
      auVar59 = vshufpd_avx(auVar65,auVar65,1);
      auVar60 = vshufpd_avx(auVar61,auVar61,1);
      auVar64 = vminss_avx(auVar50,auVar56);
      auVar50 = vmaxss_avx(auVar56,auVar50);
      auVar57 = vminss_avx(auVar65,auVar61);
      auVar56 = vmaxss_avx(auVar61,auVar65);
      auVar57 = vminss_avx(auVar64,auVar57);
      auVar50 = vmaxss_avx(auVar56,auVar50);
      auVar65 = vminss_avx(auVar66,auVar58);
      auVar56 = vmaxss_avx(auVar58,auVar66);
      auVar66 = vminss_avx(auVar59,auVar60);
      auVar64 = vmaxss_avx(auVar60,auVar59);
      auVar65 = vminss_avx(auVar65,auVar66);
      auVar56 = vmaxss_avx(auVar64,auVar56);
      vucomiss_avx512f(auVar57);
      fVar202 = auVar56._0_4_;
      fVar219 = auVar50._0_4_;
      if (((uint)uVar36 < 5) || (fVar202 <= -0.0001)) {
        uVar19 = vcmpps_avx512vl(auVar65,SUB6416(ZEXT464(0x38d1b717),0),1);
        uVar20 = vcmpps_avx512vl(auVar57,SUB6416(ZEXT464(0x38d1b717),0),1);
        if ((-0.0001 < fVar219 & ((byte)uVar20 | (byte)uVar19)) != 0) goto LAB_01b3fd6b;
        uVar19 = vcmpps_avx512vl(SUB6416(ZEXT464(0xb8d1b717),0),auVar56,5);
        uVar20 = vcmpps_avx512vl(auVar65,SUB6416(ZEXT464(0x38d1b717),0),5);
        if ((((ushort)uVar20 | (ushort)uVar19) & 1) == 0) goto LAB_01b3fd6b;
        bVar10 = true;
        auVar245 = ZEXT1664(auVar242);
      }
      else {
LAB_01b3fd6b:
        auVar58 = auVar261._0_16_;
        uVar19 = vcmpss_avx512f(auVar57,auVar58,1);
        bVar10 = (bool)((byte)uVar19 & 1);
        iVar108 = auVar257._0_4_;
        fVar214 = (float)((uint)bVar10 * -0x40800000 + (uint)!bVar10 * iVar108);
        uVar19 = vcmpss_avx512f(auVar50,auVar58,1);
        bVar10 = (bool)((byte)uVar19 & 1);
        fVar215 = (float)((uint)bVar10 * -0x40800000 + (uint)!bVar10 * iVar108);
        bVar10 = fVar214 != fVar215;
        iVar260 = auVar261._0_4_;
        auVar73._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar91._4_28_ = auVar73._4_28_;
        auVar91._0_4_ = (uint)bVar10 * iVar260 + (uint)!bVar10 * 0x7f800000;
        auVar66 = auVar91._0_16_;
        auVar93._16_16_ = auVar73._16_16_;
        auVar93._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar92._4_28_ = auVar93._4_28_;
        auVar92._0_4_ = (uint)bVar10 * iVar260 + (uint)!bVar10 * -0x800000;
        auVar64 = auVar92._0_16_;
        uVar19 = vcmpss_avx512f(auVar65,auVar58,1);
        bVar10 = (bool)((byte)uVar19 & 1);
        fVar216 = (float)((uint)bVar10 * -0x40800000 + (uint)!bVar10 * iVar108);
        if ((fVar214 != fVar216) || (NAN(fVar214) || NAN(fVar216))) {
          fVar217 = auVar65._0_4_;
          fVar214 = auVar57._0_4_;
          bVar10 = fVar217 == fVar214;
          if ((!bVar10) || (NAN(fVar217) || NAN(fVar214))) {
            auVar57 = vxorps_avx512vl(auVar57,auVar256._0_16_);
            auVar249._0_4_ = auVar57._0_4_ / (fVar217 - fVar214);
            auVar249._4_12_ = auVar57._4_12_;
            auVar57 = vsubss_avx512f(auVar49,auVar249);
            auVar65 = vfmadd213ss_avx512f(auVar57,auVar58,auVar249);
            auVar57 = auVar65;
          }
          else {
            vucomiss_avx512f(auVar58);
            auVar95._16_16_ = auVar73._16_16_;
            auVar95._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar94._4_28_ = auVar95._4_28_;
            auVar94._0_4_ = (uint)bVar10 * iVar260 + (uint)!bVar10 * 0x7f800000;
            auVar65 = auVar94._0_16_;
            auVar57 = ZEXT416((uint)bVar10 * 0x3f800000 + (uint)!bVar10 * -0x800000);
          }
          auVar66 = vminss_avx(auVar66,auVar65);
          auVar64 = vmaxss_avx(auVar57,auVar64);
        }
        uVar19 = vcmpss_avx512f(auVar56,auVar58,1);
        bVar10 = (bool)((byte)uVar19 & 1);
        fVar214 = (float)((uint)bVar10 * -0x40800000 + (uint)!bVar10 * iVar108);
        if ((fVar215 != fVar214) || (NAN(fVar215) || NAN(fVar214))) {
          bVar10 = fVar202 == fVar219;
          if ((!bVar10) || (NAN(fVar202) || NAN(fVar219))) {
            auVar50 = vxorps_avx512vl(auVar50,auVar256._0_16_);
            auVar207._0_4_ = auVar50._0_4_ / (fVar202 - fVar219);
            auVar207._4_12_ = auVar50._4_12_;
            auVar50 = vsubss_avx512f(auVar49,auVar207);
            auVar56 = vfmadd213ss_avx512f(auVar50,auVar58,auVar207);
            auVar50 = auVar56;
          }
          else {
            vucomiss_avx512f(auVar58);
            auVar97._16_16_ = auVar73._16_16_;
            auVar97._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar96._4_28_ = auVar97._4_28_;
            auVar96._0_4_ = (uint)bVar10 * iVar260 + (uint)!bVar10 * 0x7f800000;
            auVar56 = auVar96._0_16_;
            auVar50 = ZEXT416((uint)bVar10 * 0x3f800000 + (uint)!bVar10 * -0x800000);
          }
          auVar66 = vminss_avx(auVar66,auVar56);
          auVar64 = vmaxss_avx(auVar50,auVar64);
        }
        bVar10 = fVar216 != fVar214;
        auVar50 = vminss_avx512f(auVar66,auVar49);
        auVar99._16_16_ = auVar73._16_16_;
        auVar99._0_16_ = auVar66;
        auVar98._4_28_ = auVar99._4_28_;
        auVar98._0_4_ = (uint)bVar10 * auVar50._0_4_ + (uint)!bVar10 * auVar66._0_4_;
        auVar50 = vmaxss_avx512f(auVar49,auVar64);
        auVar101._16_16_ = auVar73._16_16_;
        auVar101._0_16_ = auVar64;
        auVar100._4_28_ = auVar101._4_28_;
        auVar100._0_4_ = (uint)bVar10 * auVar50._0_4_ + (uint)!bVar10 * auVar64._0_4_;
        auVar50 = vmaxss_avx512f(auVar58,auVar98._0_16_);
        auVar56 = vminss_avx512f(auVar100._0_16_,auVar49);
        bVar10 = true;
        if (auVar50._0_4_ <= auVar56._0_4_) {
          auVar58 = vmaxss_avx512f(auVar58,ZEXT416((uint)(auVar50._0_4_ + -0.1)));
          auVar59 = vminss_avx512f(ZEXT416((uint)(auVar56._0_4_ + 0.1)),auVar49);
          auVar118._0_8_ = auVar62._0_8_;
          auVar118._8_8_ = auVar118._0_8_;
          auVar200._8_8_ = auVar155._0_8_;
          auVar200._0_8_ = auVar155._0_8_;
          auVar208._8_8_ = auVar69._0_8_;
          auVar208._0_8_ = auVar69._0_8_;
          auVar50 = vshufpd_avx(auVar155,auVar155,3);
          auVar56 = vshufpd_avx(auVar69,auVar69,3);
          auVar64 = vshufps_avx(auVar58,auVar59,0);
          auVar60 = vsubps_avx512vl(auVar239,auVar64);
          fVar219 = auVar64._0_4_;
          auVar243._0_4_ = fVar219 * auVar67._0_4_;
          fVar202 = auVar64._4_4_;
          auVar243._4_4_ = fVar202 * auVar67._4_4_;
          fVar214 = auVar64._8_4_;
          auVar243._8_4_ = fVar214 * auVar67._8_4_;
          fVar215 = auVar64._12_4_;
          auVar243._12_4_ = fVar215 * auVar67._12_4_;
          auVar156._0_4_ = fVar219 * auVar50._0_4_;
          auVar156._4_4_ = fVar202 * auVar50._4_4_;
          auVar156._8_4_ = fVar214 * auVar50._8_4_;
          auVar156._12_4_ = fVar215 * auVar50._12_4_;
          auVar166._0_4_ = fVar219 * auVar56._0_4_;
          auVar166._4_4_ = fVar202 * auVar56._4_4_;
          auVar166._8_4_ = fVar214 * auVar56._8_4_;
          auVar166._12_4_ = fVar215 * auVar56._12_4_;
          auVar139._0_4_ = fVar219 * auVar63._0_4_;
          auVar139._4_4_ = fVar202 * auVar63._4_4_;
          auVar139._8_4_ = fVar214 * auVar63._8_4_;
          auVar139._12_4_ = fVar215 * auVar63._12_4_;
          auVar57 = vfmadd231ps_fma(auVar243,auVar60,auVar118);
          auVar65 = vfmadd231ps_fma(auVar156,auVar60,auVar200);
          auVar66 = vfmadd231ps_fma(auVar166,auVar60,auVar208);
          auVar67 = vfmadd231ps_fma(auVar139,auVar60,ZEXT816(0));
          auVar50 = vsubss_avx512f(auVar49,auVar58);
          auVar56 = vmovshdup_avx512vl(auVar242);
          auVar61 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar56._0_4_ * auVar58._0_4_)),auVar242,
                                        auVar50);
          auVar50 = vsubss_avx512f(auVar49,auVar59);
          auVar62 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar59._0_4_ * auVar56._0_4_)),auVar242,
                                        auVar50);
          auVar63 = vdivss_avx512f(auVar49,auVar48);
          auVar48 = vsubps_avx(auVar65,auVar57);
          auVar254 = auVar255._0_16_;
          auVar56 = vmulps_avx512vl(auVar48,auVar254);
          auVar48 = vsubps_avx(auVar66,auVar65);
          auVar64 = vmulps_avx512vl(auVar48,auVar254);
          auVar48 = vsubps_avx(auVar67,auVar66);
          auVar48 = vmulps_avx512vl(auVar48,auVar254);
          auVar50 = vminps_avx(auVar64,auVar48);
          auVar48 = vmaxps_avx(auVar64,auVar48);
          auVar50 = vminps_avx(auVar56,auVar50);
          auVar48 = vmaxps_avx(auVar56,auVar48);
          auVar56 = vshufpd_avx(auVar50,auVar50,3);
          auVar64 = vshufpd_avx(auVar48,auVar48,3);
          auVar50 = vminps_avx(auVar50,auVar56);
          auVar48 = vmaxps_avx(auVar48,auVar64);
          fVar219 = auVar63._0_4_;
          auVar189._0_4_ = fVar219 * auVar50._0_4_;
          auVar189._4_4_ = fVar219 * auVar50._4_4_;
          auVar189._8_4_ = fVar219 * auVar50._8_4_;
          auVar189._12_4_ = fVar219 * auVar50._12_4_;
          auVar175._0_4_ = fVar219 * auVar48._0_4_;
          auVar175._4_4_ = fVar219 * auVar48._4_4_;
          auVar175._8_4_ = fVar219 * auVar48._8_4_;
          auVar175._12_4_ = fVar219 * auVar48._12_4_;
          auVar63 = vdivss_avx512f(auVar49,ZEXT416((uint)(auVar62._0_4_ - auVar61._0_4_)));
          auVar48 = vshufpd_avx(auVar57,auVar57,3);
          auVar50 = vshufpd_avx(auVar65,auVar65,3);
          auVar56 = vshufpd_avx(auVar66,auVar66,3);
          auVar64 = vshufpd_avx(auVar67,auVar67,3);
          auVar48 = vsubps_avx(auVar48,auVar57);
          auVar57 = vsubps_avx(auVar50,auVar65);
          auVar65 = vsubps_avx(auVar56,auVar66);
          auVar64 = vsubps_avx(auVar64,auVar67);
          auVar50 = vminps_avx(auVar48,auVar57);
          auVar48 = vmaxps_avx(auVar48,auVar57);
          auVar56 = vminps_avx(auVar65,auVar64);
          auVar56 = vminps_avx(auVar50,auVar56);
          auVar50 = vmaxps_avx(auVar65,auVar64);
          auVar48 = vmaxps_avx(auVar48,auVar50);
          fVar219 = auVar63._0_4_;
          auVar209._0_4_ = fVar219 * auVar56._0_4_;
          auVar209._4_4_ = fVar219 * auVar56._4_4_;
          auVar209._8_4_ = fVar219 * auVar56._8_4_;
          auVar209._12_4_ = fVar219 * auVar56._12_4_;
          auVar221._0_4_ = fVar219 * auVar48._0_4_;
          auVar221._4_4_ = fVar219 * auVar48._4_4_;
          auVar221._8_4_ = fVar219 * auVar48._8_4_;
          auVar221._12_4_ = fVar219 * auVar48._12_4_;
          auVar69 = vinsertps_avx512f(auVar47,auVar61,0x10);
          auVar57 = vinsertps_avx(auVar44,auVar62,0x10);
          auVar111._0_4_ = auVar69._0_4_ + auVar57._0_4_;
          auVar111._4_4_ = auVar69._4_4_ + auVar57._4_4_;
          auVar111._8_4_ = auVar69._8_4_ + auVar57._8_4_;
          auVar111._12_4_ = auVar69._12_4_ + auVar57._12_4_;
          auVar21._8_4_ = 0x3f000000;
          auVar21._0_8_ = 0x3f0000003f000000;
          auVar21._12_4_ = 0x3f000000;
          auVar59 = vmulps_avx512vl(auVar111,auVar21);
          auVar56 = vshufps_avx(auVar59,auVar59,0x54);
          uVar112 = auVar59._0_4_;
          auVar132._4_4_ = uVar112;
          auVar132._0_4_ = uVar112;
          auVar132._8_4_ = uVar112;
          auVar132._12_4_ = uVar112;
          auVar50 = vfmadd213ps_fma(auVar43,auVar132,auVar45);
          auVar65 = vfmadd213ps_avx512vl(auVar55,auVar132,auVar18);
          auVar64 = vfmadd213ps_fma(local_270,auVar132,auVar51);
          auVar48 = vsubps_avx(auVar65,auVar50);
          auVar50 = vfmadd213ps_fma(auVar48,auVar132,auVar50);
          auVar48 = vsubps_avx(auVar64,auVar65);
          auVar48 = vfmadd213ps_fma(auVar48,auVar132,auVar65);
          auVar48 = vsubps_avx(auVar48,auVar50);
          auVar50 = vfmadd231ps_fma(auVar50,auVar48,auVar132);
          auVar66 = vmulps_avx512vl(auVar48,auVar254);
          auVar229._8_8_ = auVar50._0_8_;
          auVar229._0_8_ = auVar50._0_8_;
          auVar48 = vshufpd_avx(auVar50,auVar50,3);
          auVar50 = vshufps_avx(auVar59,auVar59,0x55);
          auVar64 = vsubps_avx(auVar48,auVar229);
          auVar65 = vfmadd231ps_fma(auVar229,auVar50,auVar64);
          auVar250._8_8_ = auVar66._0_8_;
          auVar250._0_8_ = auVar66._0_8_;
          auVar48 = vshufpd_avx(auVar66,auVar66,3);
          auVar48 = vsubps_avx(auVar48,auVar250);
          auVar50 = vfmadd213ps_fma(auVar48,auVar50,auVar250);
          auVar133._0_8_ = auVar64._0_8_ ^ 0x8000000080000000;
          auVar133._8_4_ = auVar64._8_4_ ^ 0x80000000;
          auVar133._12_4_ = auVar64._12_4_ ^ 0x80000000;
          auVar48 = vmovshdup_avx(auVar50);
          auVar251._0_8_ = auVar48._0_8_ ^ 0x8000000080000000;
          auVar251._8_4_ = auVar48._8_4_ ^ 0x80000000;
          auVar251._12_4_ = auVar48._12_4_ ^ 0x80000000;
          auVar66 = vmovshdup_avx512vl(auVar64);
          auVar67 = vpermt2ps_avx512vl(auVar251,ZEXT416(5),auVar64);
          auVar48 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar48._0_4_ * auVar64._0_4_)),auVar50,
                                        auVar66);
          auVar50 = vpermt2ps_avx512vl(auVar50,SUB6416(ZEXT464(4),0),auVar133);
          auVar140._0_4_ = auVar48._0_4_;
          auVar140._4_4_ = auVar140._0_4_;
          auVar140._8_4_ = auVar140._0_4_;
          auVar140._12_4_ = auVar140._0_4_;
          auVar48 = vdivps_avx(auVar67,auVar140);
          auVar50 = vdivps_avx(auVar50,auVar140);
          fVar202 = auVar65._0_4_;
          auVar64 = vshufps_avx(auVar65,auVar65,0x55);
          fVar219 = auVar50._0_4_;
          auVar230._0_4_ = fVar202 * auVar48._0_4_ + auVar64._0_4_ * fVar219;
          auVar230._4_4_ = fVar202 * auVar48._4_4_ + auVar64._4_4_ * auVar50._4_4_;
          auVar230._8_4_ = fVar202 * auVar48._8_4_ + auVar64._8_4_ * auVar50._8_4_;
          auVar230._12_4_ = fVar202 * auVar48._12_4_ + auVar64._12_4_ * auVar50._12_4_;
          auVar60 = vsubps_avx(auVar56,auVar230);
          auVar65 = vmovshdup_avx(auVar48);
          auVar56 = vinsertps_avx(auVar189,auVar209,0x1c);
          auVar252._0_4_ = auVar65._0_4_ * auVar56._0_4_;
          auVar252._4_4_ = auVar65._4_4_ * auVar56._4_4_;
          auVar252._8_4_ = auVar65._8_4_ * auVar56._8_4_;
          auVar252._12_4_ = auVar65._12_4_ * auVar56._12_4_;
          auVar64 = vinsertps_avx(auVar175,auVar221,0x1c);
          auVar231._0_4_ = auVar65._0_4_ * auVar64._0_4_;
          auVar231._4_4_ = auVar65._4_4_ * auVar64._4_4_;
          auVar231._8_4_ = auVar65._8_4_ * auVar64._8_4_;
          auVar231._12_4_ = auVar65._12_4_ * auVar64._12_4_;
          auVar58 = vminps_avx512vl(auVar252,auVar231);
          auVar67 = vmaxps_avx(auVar231,auVar252);
          auVar63 = vmovshdup_avx(auVar50);
          auVar65 = vinsertps_avx(auVar209,auVar189,0x4c);
          auVar210._0_4_ = auVar63._0_4_ * auVar65._0_4_;
          auVar210._4_4_ = auVar63._4_4_ * auVar65._4_4_;
          auVar210._8_4_ = auVar63._8_4_ * auVar65._8_4_;
          auVar210._12_4_ = auVar63._12_4_ * auVar65._12_4_;
          auVar66 = vinsertps_avx(auVar221,auVar175,0x4c);
          auVar222._0_4_ = auVar63._0_4_ * auVar66._0_4_;
          auVar222._4_4_ = auVar63._4_4_ * auVar66._4_4_;
          auVar222._8_4_ = auVar63._8_4_ * auVar66._8_4_;
          auVar222._12_4_ = auVar63._12_4_ * auVar66._12_4_;
          auVar63 = vminps_avx(auVar210,auVar222);
          auVar58 = vaddps_avx512vl(auVar58,auVar63);
          auVar63 = vmaxps_avx(auVar222,auVar210);
          auVar211._0_4_ = auVar67._0_4_ + auVar63._0_4_;
          auVar211._4_4_ = auVar67._4_4_ + auVar63._4_4_;
          auVar211._8_4_ = auVar67._8_4_ + auVar63._8_4_;
          auVar211._12_4_ = auVar67._12_4_ + auVar63._12_4_;
          auVar223._8_8_ = 0x3f80000000000000;
          auVar223._0_8_ = 0x3f80000000000000;
          auVar67 = vsubps_avx(auVar223,auVar211);
          auVar63 = vsubps_avx(auVar223,auVar58);
          auVar58 = vsubps_avx(auVar69,auVar59);
          auVar59 = vsubps_avx(auVar57,auVar59);
          fVar217 = auVar58._0_4_;
          auVar253._0_4_ = fVar217 * auVar67._0_4_;
          fVar218 = auVar58._4_4_;
          auVar253._4_4_ = fVar218 * auVar67._4_4_;
          fVar237 = auVar58._8_4_;
          auVar253._8_4_ = fVar237 * auVar67._8_4_;
          fVar238 = auVar58._12_4_;
          auVar253._12_4_ = fVar238 * auVar67._12_4_;
          auVar68 = vbroadcastss_avx512vl(auVar48);
          auVar56 = vmulps_avx512vl(auVar68,auVar56);
          auVar64 = vmulps_avx512vl(auVar68,auVar64);
          auVar68 = vminps_avx512vl(auVar56,auVar64);
          auVar56 = vmaxps_avx(auVar64,auVar56);
          auVar190._0_4_ = fVar219 * auVar65._0_4_;
          auVar190._4_4_ = fVar219 * auVar65._4_4_;
          auVar190._8_4_ = fVar219 * auVar65._8_4_;
          auVar190._12_4_ = fVar219 * auVar65._12_4_;
          auVar176._0_4_ = fVar219 * auVar66._0_4_;
          auVar176._4_4_ = fVar219 * auVar66._4_4_;
          auVar176._8_4_ = fVar219 * auVar66._8_4_;
          auVar176._12_4_ = fVar219 * auVar66._12_4_;
          auVar64 = vminps_avx(auVar190,auVar176);
          auVar65 = vaddps_avx512vl(auVar68,auVar64);
          auVar66 = vmulps_avx512vl(auVar58,auVar63);
          fVar202 = auVar59._0_4_;
          auVar212._0_4_ = fVar202 * auVar67._0_4_;
          fVar214 = auVar59._4_4_;
          auVar212._4_4_ = fVar214 * auVar67._4_4_;
          fVar215 = auVar59._8_4_;
          auVar212._8_4_ = fVar215 * auVar67._8_4_;
          fVar216 = auVar59._12_4_;
          auVar212._12_4_ = fVar216 * auVar67._12_4_;
          auVar224._0_4_ = fVar202 * auVar63._0_4_;
          auVar224._4_4_ = fVar214 * auVar63._4_4_;
          auVar224._8_4_ = fVar215 * auVar63._8_4_;
          auVar224._12_4_ = fVar216 * auVar63._12_4_;
          auVar64 = vmaxps_avx(auVar176,auVar190);
          auVar177._0_4_ = auVar56._0_4_ + auVar64._0_4_;
          auVar177._4_4_ = auVar56._4_4_ + auVar64._4_4_;
          auVar177._8_4_ = auVar56._8_4_ + auVar64._8_4_;
          auVar177._12_4_ = auVar56._12_4_ + auVar64._12_4_;
          auVar191._8_8_ = 0x3f800000;
          auVar191._0_8_ = 0x3f800000;
          auVar56 = vsubps_avx(auVar191,auVar177);
          auVar64 = vsubps_avx(auVar191,auVar65);
          auVar244._0_4_ = fVar217 * auVar56._0_4_;
          auVar244._4_4_ = fVar218 * auVar56._4_4_;
          auVar244._8_4_ = fVar237 * auVar56._8_4_;
          auVar244._12_4_ = fVar238 * auVar56._12_4_;
          auVar232._0_4_ = fVar217 * auVar64._0_4_;
          auVar232._4_4_ = fVar218 * auVar64._4_4_;
          auVar232._8_4_ = fVar237 * auVar64._8_4_;
          auVar232._12_4_ = fVar238 * auVar64._12_4_;
          auVar178._0_4_ = fVar202 * auVar56._0_4_;
          auVar178._4_4_ = fVar214 * auVar56._4_4_;
          auVar178._8_4_ = fVar215 * auVar56._8_4_;
          auVar178._12_4_ = fVar216 * auVar56._12_4_;
          auVar192._0_4_ = fVar202 * auVar64._0_4_;
          auVar192._4_4_ = fVar214 * auVar64._4_4_;
          auVar192._8_4_ = fVar215 * auVar64._8_4_;
          auVar192._12_4_ = fVar216 * auVar64._12_4_;
          auVar56 = vminps_avx(auVar244,auVar232);
          auVar64 = vminps_avx(auVar178,auVar192);
          auVar65 = vminps_avx(auVar56,auVar64);
          auVar56 = vmaxps_avx(auVar232,auVar244);
          auVar64 = vmaxps_avx(auVar192,auVar178);
          auVar64 = vmaxps_avx(auVar64,auVar56);
          auVar67 = vminps_avx512vl(auVar253,auVar66);
          auVar56 = vminps_avx(auVar212,auVar224);
          auVar56 = vminps_avx(auVar67,auVar56);
          auVar56 = vhaddps_avx(auVar65,auVar56);
          auVar66 = vmaxps_avx512vl(auVar66,auVar253);
          auVar65 = vmaxps_avx(auVar224,auVar212);
          auVar65 = vmaxps_avx(auVar65,auVar66);
          auVar64 = vhaddps_avx(auVar64,auVar65);
          auVar56 = vshufps_avx(auVar56,auVar56,0xe8);
          auVar64 = vshufps_avx(auVar64,auVar64,0xe8);
          auVar179._0_4_ = auVar56._0_4_ + auVar60._0_4_;
          auVar179._4_4_ = auVar56._4_4_ + auVar60._4_4_;
          auVar179._8_4_ = auVar56._8_4_ + auVar60._8_4_;
          auVar179._12_4_ = auVar56._12_4_ + auVar60._12_4_;
          auVar193._0_4_ = auVar64._0_4_ + auVar60._0_4_;
          auVar193._4_4_ = auVar64._4_4_ + auVar60._4_4_;
          auVar193._8_4_ = auVar64._8_4_ + auVar60._8_4_;
          auVar193._12_4_ = auVar64._12_4_ + auVar60._12_4_;
          auVar56 = vmaxps_avx(auVar69,auVar179);
          auVar64 = vminps_avx(auVar193,auVar57);
          uVar39 = vcmpps_avx512vl(auVar64,auVar56,1);
          auVar56 = vinsertps_avx(auVar61,auVar62,0x10);
          auVar245 = ZEXT1664(auVar56);
          auVar64 = ZEXT416(5);
          if ((uVar39 & 3) == 0) {
            vucomiss_avx512f(auVar47);
            auVar64 = vxorps_avx512vl(auVar64,auVar64);
            auVar261 = ZEXT1664(auVar64);
            if ((uint)uVar36 < 4 && (uVar5 == 0 || lVar40 == 0)) {
              bVar10 = false;
            }
            else {
              lVar40 = 200;
              do {
                auVar57 = vsubss_avx512f(auVar49,auVar60);
                fVar215 = auVar57._0_4_;
                fVar202 = fVar215 * fVar215 * fVar215;
                fVar216 = auVar60._0_4_;
                fVar214 = fVar216 * 3.0 * fVar215 * fVar215;
                fVar215 = fVar215 * fVar216 * fVar216 * 3.0;
                auVar157._4_4_ = fVar202;
                auVar157._0_4_ = fVar202;
                auVar157._8_4_ = fVar202;
                auVar157._12_4_ = fVar202;
                auVar148._4_4_ = fVar214;
                auVar148._0_4_ = fVar214;
                auVar148._8_4_ = fVar214;
                auVar148._12_4_ = fVar214;
                auVar119._4_4_ = fVar215;
                auVar119._0_4_ = fVar215;
                auVar119._8_4_ = fVar215;
                auVar119._12_4_ = fVar215;
                fVar216 = fVar216 * fVar216 * fVar216;
                auVar167._0_4_ = (float)local_420._0_4_ * fVar216;
                auVar167._4_4_ = (float)local_420._4_4_ * fVar216;
                auVar167._8_4_ = fStack_418 * fVar216;
                auVar167._12_4_ = fStack_414 * fVar216;
                auVar57 = vfmadd231ps_fma(auVar167,auVar51,auVar119);
                auVar57 = vfmadd231ps_fma(auVar57,auVar18,auVar148);
                auVar57 = vfmadd231ps_fma(auVar57,auVar45,auVar157);
                auVar120._8_8_ = auVar57._0_8_;
                auVar120._0_8_ = auVar57._0_8_;
                auVar57 = vshufpd_avx(auVar57,auVar57,3);
                auVar65 = vshufps_avx(auVar60,auVar60,0x55);
                auVar57 = vsubps_avx(auVar57,auVar120);
                auVar65 = vfmadd213ps_fma(auVar57,auVar65,auVar120);
                fVar202 = auVar65._0_4_;
                auVar57 = vshufps_avx(auVar65,auVar65,0x55);
                auVar121._0_4_ = auVar48._0_4_ * fVar202 + fVar219 * auVar57._0_4_;
                auVar121._4_4_ = auVar48._4_4_ * fVar202 + auVar50._4_4_ * auVar57._4_4_;
                auVar121._8_4_ = auVar48._8_4_ * fVar202 + auVar50._8_4_ * auVar57._8_4_;
                auVar121._12_4_ = auVar48._12_4_ * fVar202 + auVar50._12_4_ * auVar57._12_4_;
                auVar60 = vsubps_avx(auVar60,auVar121);
                auVar57 = vandps_avx512vl(auVar65,auVar258._0_16_);
                auVar65 = vprolq_avx512vl(auVar57,0x20);
                auVar57 = vmaxss_avx(auVar65,auVar57);
                bVar17 = auVar57._0_4_ <= (float)local_430._0_4_;
                if (auVar57._0_4_ < (float)local_430._0_4_) {
                  auVar48 = vucomiss_avx512f(auVar64);
                  if (bVar17) {
                    auVar49 = vucomiss_avx512f(auVar48);
                    auVar257 = ZEXT1664(auVar49);
                    auVar245 = ZEXT1664(auVar56);
                    if (bVar17) {
                      vmovshdup_avx(auVar48);
                      auVar49 = vucomiss_avx512f(auVar64);
                      if (bVar17) {
                        auVar50 = vucomiss_avx512f(auVar49);
                        auVar257 = ZEXT1664(auVar50);
                        if (bVar17) {
                          auVar57 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]
                                                         ),ZEXT416((uint)pre->ray_space[k].vy.
                                                                         field_0.m128[2]),0x1c);
                          auVar60 = vinsertps_avx(auVar57,ZEXT416((uint)pre->ray_space[k].vz.field_0
                                                                        .m128[2]),0x28);
                          auVar57 = vdpps_avx(auVar60,local_280,0x7f);
                          auVar65 = vdpps_avx(auVar60,local_290,0x7f);
                          auVar66 = vdpps_avx(auVar60,local_2a0,0x7f);
                          auVar67 = vdpps_avx(auVar60,local_2b0,0x7f);
                          auVar63 = vdpps_avx(auVar60,local_2c0,0x7f);
                          auVar58 = vdpps_avx(auVar60,local_2d0,0x7f);
                          auVar59 = vdpps_avx(auVar60,local_2e0,0x7f);
                          auVar60 = vdpps_avx(auVar60,local_2f0,0x7f);
                          auVar69 = vsubss_avx512f(auVar50,auVar49);
                          fVar215 = auVar49._0_4_;
                          auVar49 = vfmadd231ss_fma(ZEXT416((uint)(fVar215 * auVar63._0_4_)),auVar69
                                                    ,auVar57);
                          auVar57 = vfmadd231ss_fma(ZEXT416((uint)(auVar58._0_4_ * fVar215)),auVar69
                                                    ,auVar65);
                          auVar65 = vfmadd231ss_fma(ZEXT416((uint)(auVar59._0_4_ * fVar215)),auVar69
                                                    ,auVar66);
                          auVar66 = vfmadd231ss_fma(ZEXT416((uint)(fVar215 * auVar60._0_4_)),auVar69
                                                    ,auVar67);
                          auVar50 = vsubss_avx512f(auVar50,auVar48);
                          auVar180._0_4_ = auVar50._0_4_;
                          fVar219 = auVar180._0_4_ * auVar180._0_4_ * auVar180._0_4_;
                          local_120 = auVar48._0_4_;
                          fVar202 = local_120 * 3.0 * auVar180._0_4_ * auVar180._0_4_;
                          fVar214 = auVar180._0_4_ * local_120 * local_120 * 3.0;
                          fVar217 = local_120 * local_120 * local_120;
                          auVar50 = vfmadd231ss_fma(ZEXT416((uint)(fVar217 * auVar66._0_4_)),
                                                    ZEXT416((uint)fVar214),auVar65);
                          auVar50 = vfmadd231ss_fma(auVar50,ZEXT416((uint)fVar202),auVar57);
                          auVar49 = vfmadd231ss_fma(auVar50,ZEXT416((uint)fVar219),auVar49);
                          fVar216 = auVar49._0_4_;
                          if ((fVar109 <= fVar216) &&
                             (fVar218 = *(float *)(ray + k * 4 + 0x100), fVar216 <= fVar218)) {
                            auVar49 = vshufps_avx(auVar48,auVar48,0x55);
                            auVar65 = vsubps_avx512vl(auVar239,auVar49);
                            fVar237 = auVar49._0_4_;
                            auVar213._0_4_ = fVar237 * (float)local_310._0_4_;
                            fVar238 = auVar49._4_4_;
                            auVar213._4_4_ = fVar238 * (float)local_310._4_4_;
                            fVar246 = auVar49._8_4_;
                            auVar213._8_4_ = fVar246 * fStack_308;
                            fVar247 = auVar49._12_4_;
                            auVar213._12_4_ = fVar247 * fStack_304;
                            auVar225._0_4_ = fVar237 * (float)local_360._0_4_;
                            auVar225._4_4_ = fVar238 * (float)local_360._4_4_;
                            auVar225._8_4_ = fVar246 * fStack_358;
                            auVar225._12_4_ = fVar247 * fStack_354;
                            auVar233._0_4_ = fVar237 * (float)local_370._0_4_;
                            auVar233._4_4_ = fVar238 * (float)local_370._4_4_;
                            auVar233._8_4_ = fVar246 * fStack_368;
                            auVar233._12_4_ = fVar247 * fStack_364;
                            auVar194._0_4_ = fVar237 * (float)local_330._0_4_;
                            auVar194._4_4_ = fVar238 * (float)local_330._4_4_;
                            auVar194._8_4_ = fVar246 * fStack_328;
                            auVar194._12_4_ = fVar247 * fStack_324;
                            auVar49 = vfmadd231ps_fma(auVar213,auVar65,local_300);
                            auVar50 = vfmadd231ps_fma(auVar225,auVar65,local_340);
                            auVar57 = vfmadd231ps_fma(auVar233,auVar65,local_350);
                            auVar65 = vfmadd231ps_fma(auVar194,auVar65,local_320);
                            auVar49 = vsubps_avx(auVar50,auVar49);
                            auVar50 = vsubps_avx(auVar57,auVar50);
                            auVar57 = vsubps_avx(auVar65,auVar57);
                            auVar234._0_4_ = local_120 * auVar50._0_4_;
                            auVar234._4_4_ = local_120 * auVar50._4_4_;
                            auVar234._8_4_ = local_120 * auVar50._8_4_;
                            auVar234._12_4_ = local_120 * auVar50._12_4_;
                            auVar180._4_4_ = auVar180._0_4_;
                            auVar180._8_4_ = auVar180._0_4_;
                            auVar180._12_4_ = auVar180._0_4_;
                            auVar49 = vfmadd231ps_fma(auVar234,auVar180,auVar49);
                            auVar195._0_4_ = local_120 * auVar57._0_4_;
                            auVar195._4_4_ = local_120 * auVar57._4_4_;
                            auVar195._8_4_ = local_120 * auVar57._8_4_;
                            auVar195._12_4_ = local_120 * auVar57._12_4_;
                            auVar50 = vfmadd231ps_fma(auVar195,auVar180,auVar50);
                            auVar196._0_4_ = local_120 * auVar50._0_4_;
                            auVar196._4_4_ = local_120 * auVar50._4_4_;
                            auVar196._8_4_ = local_120 * auVar50._8_4_;
                            auVar196._12_4_ = local_120 * auVar50._12_4_;
                            auVar49 = vfmadd231ps_fma(auVar196,auVar180,auVar49);
                            auVar49 = vmulps_avx512vl(auVar49,auVar254);
                            pGVar6 = (context->scene->geometries).items[uVar41].ptr;
                            if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                              auVar168._0_4_ = fVar217 * (float)local_3b0._0_4_;
                              auVar168._4_4_ = fVar217 * (float)local_3b0._4_4_;
                              auVar168._8_4_ = fVar217 * fStack_3a8;
                              auVar168._12_4_ = fVar217 * fStack_3a4;
                              auVar158._4_4_ = fVar214;
                              auVar158._0_4_ = fVar214;
                              auVar158._8_4_ = fVar214;
                              auVar158._12_4_ = fVar214;
                              auVar50 = vfmadd132ps_fma(auVar158,auVar168,local_3a0);
                              auVar149._4_4_ = fVar202;
                              auVar149._0_4_ = fVar202;
                              auVar149._8_4_ = fVar202;
                              auVar149._12_4_ = fVar202;
                              auVar50 = vfmadd132ps_fma(auVar149,auVar50,local_390);
                              auVar141._4_4_ = fVar219;
                              auVar141._0_4_ = fVar219;
                              auVar141._8_4_ = fVar219;
                              auVar141._12_4_ = fVar219;
                              auVar65 = vfmadd132ps_fma(auVar141,auVar50,local_380);
                              auVar50 = vshufps_avx(auVar65,auVar65,0xc9);
                              auVar57 = vshufps_avx(auVar49,auVar49,0xc9);
                              auVar142._0_4_ = auVar65._0_4_ * auVar57._0_4_;
                              auVar142._4_4_ = auVar65._4_4_ * auVar57._4_4_;
                              auVar142._8_4_ = auVar65._8_4_ * auVar57._8_4_;
                              auVar142._12_4_ = auVar65._12_4_ * auVar57._12_4_;
                              auVar49 = vfmsub231ps_fma(auVar142,auVar49,auVar50);
                              local_140 = auVar49._0_4_;
                              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                                 (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                                *(float *)(ray + k * 4 + 0x100) = fVar216;
                                uVar112 = vextractps_avx(auVar49,1);
                                *(undefined4 *)(ray + k * 4 + 0x180) = uVar112;
                                uVar112 = vextractps_avx(auVar49,2);
                                *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar112;
                                *(undefined4 *)(ray + k * 4 + 0x1c0) = local_140;
                                *(float *)(ray + k * 4 + 0x1e0) = local_120;
                                *(float *)(ray + k * 4 + 0x200) = fVar215;
                                *(uint *)(ray + k * 4 + 0x220) = uVar4;
                                *(uint *)(ray + k * 4 + 0x240) = uVar41;
                                *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                                *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                              }
                              else {
                                auVar151._8_4_ = 1;
                                auVar151._0_8_ = 0x100000001;
                                auVar151._12_4_ = 1;
                                auVar151._16_4_ = 1;
                                auVar151._20_4_ = 1;
                                auVar151._24_4_ = 1;
                                auVar151._28_4_ = 1;
                                local_100 = vpermps_avx2(auVar151,ZEXT1632(auVar48));
                                auVar87 = vpermps_avx2(auVar151,ZEXT1632(auVar49));
                                auVar159._8_4_ = 2;
                                auVar159._0_8_ = 0x200000002;
                                auVar159._12_4_ = 2;
                                auVar159._16_4_ = 2;
                                auVar159._20_4_ = 2;
                                auVar159._24_4_ = 2;
                                auVar159._28_4_ = 2;
                                local_160 = vpermps_avx2(auVar159,ZEXT1632(auVar49));
                                local_180[0] = (RTCHitN)auVar87[0];
                                local_180[1] = (RTCHitN)auVar87[1];
                                local_180[2] = (RTCHitN)auVar87[2];
                                local_180[3] = (RTCHitN)auVar87[3];
                                local_180[4] = (RTCHitN)auVar87[4];
                                local_180[5] = (RTCHitN)auVar87[5];
                                local_180[6] = (RTCHitN)auVar87[6];
                                local_180[7] = (RTCHitN)auVar87[7];
                                local_180[8] = (RTCHitN)auVar87[8];
                                local_180[9] = (RTCHitN)auVar87[9];
                                local_180[10] = (RTCHitN)auVar87[10];
                                local_180[0xb] = (RTCHitN)auVar87[0xb];
                                local_180[0xc] = (RTCHitN)auVar87[0xc];
                                local_180[0xd] = (RTCHitN)auVar87[0xd];
                                local_180[0xe] = (RTCHitN)auVar87[0xe];
                                local_180[0xf] = (RTCHitN)auVar87[0xf];
                                local_180[0x10] = (RTCHitN)auVar87[0x10];
                                local_180[0x11] = (RTCHitN)auVar87[0x11];
                                local_180[0x12] = (RTCHitN)auVar87[0x12];
                                local_180[0x13] = (RTCHitN)auVar87[0x13];
                                local_180[0x14] = (RTCHitN)auVar87[0x14];
                                local_180[0x15] = (RTCHitN)auVar87[0x15];
                                local_180[0x16] = (RTCHitN)auVar87[0x16];
                                local_180[0x17] = (RTCHitN)auVar87[0x17];
                                local_180[0x18] = (RTCHitN)auVar87[0x18];
                                local_180[0x19] = (RTCHitN)auVar87[0x19];
                                local_180[0x1a] = (RTCHitN)auVar87[0x1a];
                                local_180[0x1b] = (RTCHitN)auVar87[0x1b];
                                local_180[0x1c] = (RTCHitN)auVar87[0x1c];
                                local_180[0x1d] = (RTCHitN)auVar87[0x1d];
                                local_180[0x1e] = (RTCHitN)auVar87[0x1e];
                                local_180[0x1f] = (RTCHitN)auVar87[0x1f];
                                uStack_13c = local_140;
                                uStack_138 = local_140;
                                uStack_134 = local_140;
                                uStack_130 = local_140;
                                uStack_12c = local_140;
                                uStack_128 = local_140;
                                uStack_124 = local_140;
                                fStack_11c = local_120;
                                fStack_118 = local_120;
                                fStack_114 = local_120;
                                fStack_110 = local_120;
                                fStack_10c = local_120;
                                fStack_108 = local_120;
                                fStack_104 = local_120;
                                local_e0 = local_220._0_8_;
                                uStack_d8 = local_220._8_8_;
                                uStack_d0 = local_220._16_8_;
                                uStack_c8 = local_220._24_8_;
                                local_c0 = local_200;
                                vpcmpeqd_avx2(local_200,local_200);
                                uStack_9c = context->user->instID[0];
                                local_a0 = uStack_9c;
                                uStack_98 = uStack_9c;
                                uStack_94 = uStack_9c;
                                uStack_90 = uStack_9c;
                                uStack_8c = uStack_9c;
                                uStack_88 = uStack_9c;
                                uStack_84 = uStack_9c;
                                uStack_7c = context->user->instPrimID[0];
                                local_80 = uStack_7c;
                                uStack_78 = uStack_7c;
                                uStack_74 = uStack_7c;
                                uStack_70 = uStack_7c;
                                uStack_6c = uStack_7c;
                                uStack_68 = uStack_7c;
                                uStack_64 = uStack_7c;
                                *(float *)(ray + k * 4 + 0x100) = fVar216;
                                local_3e0 = local_240._0_8_;
                                uStack_3d8 = local_240._8_8_;
                                uStack_3d0 = local_240._16_8_;
                                uStack_3c8 = local_240._24_8_;
                                local_460.valid = (int *)&local_3e0;
                                local_460.geometryUserPtr = pGVar6->userPtr;
                                local_460.context = context->user;
                                local_460.hit = local_180;
                                local_460.N = 8;
                                local_460.ray = (RTCRayN *)ray;
                                if (pGVar6->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                                  (*pGVar6->intersectionFilterN)(&local_460);
                                  auVar48 = vxorps_avx512vl(auVar64,auVar64);
                                  auVar261 = ZEXT1664(auVar48);
                                  auVar257 = ZEXT464(0x3f800000);
                                  auVar73 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                  in_ZMM19 = ZEXT3264(auVar73);
                                  auVar48 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                  auVar256 = ZEXT1664(auVar48);
                                  auVar48 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                  auVar258 = ZEXT1664(auVar48);
                                }
                                auVar48 = auVar261._0_16_;
                                auVar32._8_8_ = uStack_3d8;
                                auVar32._0_8_ = local_3e0;
                                auVar32._16_8_ = uStack_3d0;
                                auVar32._24_8_ = uStack_3c8;
                                if (auVar32 == (undefined1  [32])0x0) {
LAB_01b40c35:
                                  *(float *)(ray + k * 4 + 0x100) = fVar218;
                                }
                                else {
                                  p_Var9 = context->args->filter;
                                  if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                                     (((context->args->flags &
                                       RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                      (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                                    (*p_Var9)(&local_460);
                                    auVar48 = vxorps_avx512vl(auVar48,auVar48);
                                    auVar261 = ZEXT1664(auVar48);
                                    auVar257 = ZEXT464(0x3f800000);
                                    auVar73 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                    in_ZMM19 = ZEXT3264(auVar73);
                                    auVar48 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                    auVar256 = ZEXT1664(auVar48);
                                    auVar48 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                    auVar258 = ZEXT1664(auVar48);
                                  }
                                  auVar33._8_8_ = uStack_3d8;
                                  auVar33._0_8_ = local_3e0;
                                  auVar33._16_8_ = uStack_3d0;
                                  auVar33._24_8_ = uStack_3c8;
                                  if (auVar33 == (undefined1  [32])0x0) goto LAB_01b40c35;
                                  uVar39 = vptestmd_avx512vl(auVar33,auVar33);
                                  iVar108 = *(int *)(local_460.hit + 4);
                                  iVar260 = *(int *)(local_460.hit + 8);
                                  iVar27 = *(int *)(local_460.hit + 0xc);
                                  iVar28 = *(int *)(local_460.hit + 0x10);
                                  iVar29 = *(int *)(local_460.hit + 0x14);
                                  iVar30 = *(int *)(local_460.hit + 0x18);
                                  iVar31 = *(int *)(local_460.hit + 0x1c);
                                  bVar34 = (byte)uVar39;
                                  bVar17 = (bool)((byte)(uVar39 >> 1) & 1);
                                  bVar11 = (bool)((byte)(uVar39 >> 2) & 1);
                                  bVar12 = (bool)((byte)(uVar39 >> 3) & 1);
                                  bVar13 = (bool)((byte)(uVar39 >> 4) & 1);
                                  bVar14 = (bool)((byte)(uVar39 >> 5) & 1);
                                  bVar15 = (bool)((byte)(uVar39 >> 6) & 1);
                                  bVar16 = SUB81(uVar39 >> 7,0);
                                  *(uint *)(local_460.ray + 0x180) =
                                       (uint)(bVar34 & 1) * *(int *)local_460.hit |
                                       (uint)!(bool)(bVar34 & 1) * *(int *)(local_460.ray + 0x180);
                                  *(uint *)(local_460.ray + 0x184) =
                                       (uint)bVar17 * iVar108 |
                                       (uint)!bVar17 * *(int *)(local_460.ray + 0x184);
                                  *(uint *)(local_460.ray + 0x188) =
                                       (uint)bVar11 * iVar260 |
                                       (uint)!bVar11 * *(int *)(local_460.ray + 0x188);
                                  *(uint *)(local_460.ray + 0x18c) =
                                       (uint)bVar12 * iVar27 |
                                       (uint)!bVar12 * *(int *)(local_460.ray + 0x18c);
                                  *(uint *)(local_460.ray + 400) =
                                       (uint)bVar13 * iVar28 |
                                       (uint)!bVar13 * *(int *)(local_460.ray + 400);
                                  *(uint *)(local_460.ray + 0x194) =
                                       (uint)bVar14 * iVar29 |
                                       (uint)!bVar14 * *(int *)(local_460.ray + 0x194);
                                  *(uint *)(local_460.ray + 0x198) =
                                       (uint)bVar15 * iVar30 |
                                       (uint)!bVar15 * *(int *)(local_460.ray + 0x198);
                                  *(uint *)(local_460.ray + 0x19c) =
                                       (uint)bVar16 * iVar31 |
                                       (uint)!bVar16 * *(int *)(local_460.ray + 0x19c);
                                  iVar108 = *(int *)(local_460.hit + 0x24);
                                  iVar260 = *(int *)(local_460.hit + 0x28);
                                  iVar27 = *(int *)(local_460.hit + 0x2c);
                                  iVar28 = *(int *)(local_460.hit + 0x30);
                                  iVar29 = *(int *)(local_460.hit + 0x34);
                                  iVar30 = *(int *)(local_460.hit + 0x38);
                                  iVar31 = *(int *)(local_460.hit + 0x3c);
                                  bVar17 = (bool)((byte)(uVar39 >> 1) & 1);
                                  bVar11 = (bool)((byte)(uVar39 >> 2) & 1);
                                  bVar12 = (bool)((byte)(uVar39 >> 3) & 1);
                                  bVar13 = (bool)((byte)(uVar39 >> 4) & 1);
                                  bVar14 = (bool)((byte)(uVar39 >> 5) & 1);
                                  bVar15 = (bool)((byte)(uVar39 >> 6) & 1);
                                  bVar16 = SUB81(uVar39 >> 7,0);
                                  *(uint *)(local_460.ray + 0x1a0) =
                                       (uint)(bVar34 & 1) * *(int *)(local_460.hit + 0x20) |
                                       (uint)!(bool)(bVar34 & 1) * *(int *)(local_460.ray + 0x1a0);
                                  *(uint *)(local_460.ray + 0x1a4) =
                                       (uint)bVar17 * iVar108 |
                                       (uint)!bVar17 * *(int *)(local_460.ray + 0x1a4);
                                  *(uint *)(local_460.ray + 0x1a8) =
                                       (uint)bVar11 * iVar260 |
                                       (uint)!bVar11 * *(int *)(local_460.ray + 0x1a8);
                                  *(uint *)(local_460.ray + 0x1ac) =
                                       (uint)bVar12 * iVar27 |
                                       (uint)!bVar12 * *(int *)(local_460.ray + 0x1ac);
                                  *(uint *)(local_460.ray + 0x1b0) =
                                       (uint)bVar13 * iVar28 |
                                       (uint)!bVar13 * *(int *)(local_460.ray + 0x1b0);
                                  *(uint *)(local_460.ray + 0x1b4) =
                                       (uint)bVar14 * iVar29 |
                                       (uint)!bVar14 * *(int *)(local_460.ray + 0x1b4);
                                  *(uint *)(local_460.ray + 0x1b8) =
                                       (uint)bVar15 * iVar30 |
                                       (uint)!bVar15 * *(int *)(local_460.ray + 0x1b8);
                                  *(uint *)(local_460.ray + 0x1bc) =
                                       (uint)bVar16 * iVar31 |
                                       (uint)!bVar16 * *(int *)(local_460.ray + 0x1bc);
                                  iVar108 = *(int *)(local_460.hit + 0x44);
                                  iVar260 = *(int *)(local_460.hit + 0x48);
                                  iVar27 = *(int *)(local_460.hit + 0x4c);
                                  iVar28 = *(int *)(local_460.hit + 0x50);
                                  iVar29 = *(int *)(local_460.hit + 0x54);
                                  iVar30 = *(int *)(local_460.hit + 0x58);
                                  iVar31 = *(int *)(local_460.hit + 0x5c);
                                  bVar17 = (bool)((byte)(uVar39 >> 1) & 1);
                                  bVar11 = (bool)((byte)(uVar39 >> 2) & 1);
                                  bVar12 = (bool)((byte)(uVar39 >> 3) & 1);
                                  bVar13 = (bool)((byte)(uVar39 >> 4) & 1);
                                  bVar14 = (bool)((byte)(uVar39 >> 5) & 1);
                                  bVar15 = (bool)((byte)(uVar39 >> 6) & 1);
                                  bVar16 = SUB81(uVar39 >> 7,0);
                                  *(uint *)(local_460.ray + 0x1c0) =
                                       (uint)(bVar34 & 1) * *(int *)(local_460.hit + 0x40) |
                                       (uint)!(bool)(bVar34 & 1) * *(int *)(local_460.ray + 0x1c0);
                                  *(uint *)(local_460.ray + 0x1c4) =
                                       (uint)bVar17 * iVar108 |
                                       (uint)!bVar17 * *(int *)(local_460.ray + 0x1c4);
                                  *(uint *)(local_460.ray + 0x1c8) =
                                       (uint)bVar11 * iVar260 |
                                       (uint)!bVar11 * *(int *)(local_460.ray + 0x1c8);
                                  *(uint *)(local_460.ray + 0x1cc) =
                                       (uint)bVar12 * iVar27 |
                                       (uint)!bVar12 * *(int *)(local_460.ray + 0x1cc);
                                  *(uint *)(local_460.ray + 0x1d0) =
                                       (uint)bVar13 * iVar28 |
                                       (uint)!bVar13 * *(int *)(local_460.ray + 0x1d0);
                                  *(uint *)(local_460.ray + 0x1d4) =
                                       (uint)bVar14 * iVar29 |
                                       (uint)!bVar14 * *(int *)(local_460.ray + 0x1d4);
                                  *(uint *)(local_460.ray + 0x1d8) =
                                       (uint)bVar15 * iVar30 |
                                       (uint)!bVar15 * *(int *)(local_460.ray + 0x1d8);
                                  *(uint *)(local_460.ray + 0x1dc) =
                                       (uint)bVar16 * iVar31 |
                                       (uint)!bVar16 * *(int *)(local_460.ray + 0x1dc);
                                  iVar108 = *(int *)(local_460.hit + 100);
                                  iVar260 = *(int *)(local_460.hit + 0x68);
                                  iVar27 = *(int *)(local_460.hit + 0x6c);
                                  iVar28 = *(int *)(local_460.hit + 0x70);
                                  iVar29 = *(int *)(local_460.hit + 0x74);
                                  iVar30 = *(int *)(local_460.hit + 0x78);
                                  iVar31 = *(int *)(local_460.hit + 0x7c);
                                  bVar17 = (bool)((byte)(uVar39 >> 1) & 1);
                                  bVar11 = (bool)((byte)(uVar39 >> 2) & 1);
                                  bVar12 = (bool)((byte)(uVar39 >> 3) & 1);
                                  bVar13 = (bool)((byte)(uVar39 >> 4) & 1);
                                  bVar14 = (bool)((byte)(uVar39 >> 5) & 1);
                                  bVar15 = (bool)((byte)(uVar39 >> 6) & 1);
                                  bVar16 = SUB81(uVar39 >> 7,0);
                                  *(uint *)(local_460.ray + 0x1e0) =
                                       (uint)(bVar34 & 1) * *(int *)(local_460.hit + 0x60) |
                                       (uint)!(bool)(bVar34 & 1) * *(int *)(local_460.ray + 0x1e0);
                                  *(uint *)(local_460.ray + 0x1e4) =
                                       (uint)bVar17 * iVar108 |
                                       (uint)!bVar17 * *(int *)(local_460.ray + 0x1e4);
                                  *(uint *)(local_460.ray + 0x1e8) =
                                       (uint)bVar11 * iVar260 |
                                       (uint)!bVar11 * *(int *)(local_460.ray + 0x1e8);
                                  *(uint *)(local_460.ray + 0x1ec) =
                                       (uint)bVar12 * iVar27 |
                                       (uint)!bVar12 * *(int *)(local_460.ray + 0x1ec);
                                  *(uint *)(local_460.ray + 0x1f0) =
                                       (uint)bVar13 * iVar28 |
                                       (uint)!bVar13 * *(int *)(local_460.ray + 0x1f0);
                                  *(uint *)(local_460.ray + 500) =
                                       (uint)bVar14 * iVar29 |
                                       (uint)!bVar14 * *(int *)(local_460.ray + 500);
                                  *(uint *)(local_460.ray + 0x1f8) =
                                       (uint)bVar15 * iVar30 |
                                       (uint)!bVar15 * *(int *)(local_460.ray + 0x1f8);
                                  *(uint *)(local_460.ray + 0x1fc) =
                                       (uint)bVar16 * iVar31 |
                                       (uint)!bVar16 * *(int *)(local_460.ray + 0x1fc);
                                  iVar108 = *(int *)(local_460.ray + 0x204);
                                  iVar260 = *(int *)(local_460.ray + 0x208);
                                  iVar27 = *(int *)(local_460.ray + 0x20c);
                                  iVar28 = *(int *)(local_460.ray + 0x210);
                                  iVar29 = *(int *)(local_460.ray + 0x214);
                                  iVar30 = *(int *)(local_460.ray + 0x218);
                                  iVar31 = *(int *)(local_460.ray + 0x21c);
                                  auVar102._0_4_ =
                                       (uint)(bVar34 & 1) * *(int *)(local_460.hit + 0x80) |
                                       (uint)!(bool)(bVar34 & 1) * *(int *)(local_460.ray + 0x200);
                                  bVar17 = (bool)((byte)(uVar39 >> 1) & 1);
                                  auVar102._4_4_ =
                                       (uint)bVar17 * *(int *)(local_460.hit + 0x84) |
                                       (uint)!bVar17 * iVar108;
                                  bVar17 = (bool)((byte)(uVar39 >> 2) & 1);
                                  auVar102._8_4_ =
                                       (uint)bVar17 * *(int *)(local_460.hit + 0x88) |
                                       (uint)!bVar17 * iVar260;
                                  bVar17 = (bool)((byte)(uVar39 >> 3) & 1);
                                  auVar102._12_4_ =
                                       (uint)bVar17 * *(int *)(local_460.hit + 0x8c) |
                                       (uint)!bVar17 * iVar27;
                                  bVar17 = (bool)((byte)(uVar39 >> 4) & 1);
                                  auVar102._16_4_ =
                                       (uint)bVar17 * *(int *)(local_460.hit + 0x90) |
                                       (uint)!bVar17 * iVar28;
                                  bVar17 = (bool)((byte)(uVar39 >> 5) & 1);
                                  auVar102._20_4_ =
                                       (uint)bVar17 * *(int *)(local_460.hit + 0x94) |
                                       (uint)!bVar17 * iVar29;
                                  bVar17 = (bool)((byte)(uVar39 >> 6) & 1);
                                  auVar102._24_4_ =
                                       (uint)bVar17 * *(int *)(local_460.hit + 0x98) |
                                       (uint)!bVar17 * iVar30;
                                  bVar17 = SUB81(uVar39 >> 7,0);
                                  auVar102._28_4_ =
                                       (uint)bVar17 * *(int *)(local_460.hit + 0x9c) |
                                       (uint)!bVar17 * iVar31;
                                  *(undefined1 (*) [32])(local_460.ray + 0x200) = auVar102;
                                  bVar17 = (bool)((byte)(uVar39 >> 1) & 1);
                                  uVar107 = bVar17 * auVar102._4_4_ | (uint)!bVar17 * iVar108;
                                  auVar23._4_24_ = auVar102._8_24_;
                                  auVar23._0_4_ = uVar107;
                                  auVar103._0_8_ = auVar23._0_8_ << 0x20;
                                  bVar17 = (bool)((byte)(uVar39 >> 2) & 1);
                                  auVar103._8_4_ = bVar17 * auVar102._8_4_ | (uint)!bVar17 * iVar260
                                  ;
                                  bVar17 = (bool)((byte)(uVar39 >> 3) & 1);
                                  auVar103._12_4_ =
                                       bVar17 * auVar102._12_4_ | (uint)!bVar17 * iVar27;
                                  bVar17 = (bool)((byte)(uVar39 >> 4) & 1);
                                  auVar103._16_4_ =
                                       bVar17 * auVar102._16_4_ | (uint)!bVar17 * iVar28;
                                  bVar17 = (bool)((byte)(uVar39 >> 5) & 1);
                                  auVar103._20_4_ =
                                       bVar17 * auVar102._20_4_ | (uint)!bVar17 * iVar29;
                                  bVar17 = (bool)((byte)(uVar39 >> 6) & 1);
                                  auVar103._24_4_ =
                                       bVar17 * auVar102._24_4_ | (uint)!bVar17 * iVar30;
                                  bVar17 = SUB81(uVar39 >> 7,0);
                                  auVar103._28_4_ =
                                       bVar17 * auVar102._28_4_ | (uint)!bVar17 * iVar31;
                                  auVar73 = vmovdqu32_avx512vl(*(undefined1 (*) [32])
                                                                (local_460.hit + 0xa0));
                                  *(undefined1 (*) [32])(local_460.ray + 0x220) = auVar73;
                                  bVar17 = (bool)((byte)(uVar39 >> 1) & 1);
                                  uVar107 = bVar17 * uVar107 | (uint)!bVar17 * iVar108;
                                  auVar24._4_24_ = auVar103._8_24_;
                                  auVar24._0_4_ = uVar107;
                                  auVar104._0_8_ = auVar24._0_8_ << 0x20;
                                  bVar17 = (bool)((byte)(uVar39 >> 2) & 1);
                                  auVar104._8_4_ = bVar17 * auVar103._8_4_ | (uint)!bVar17 * iVar260
                                  ;
                                  bVar17 = (bool)((byte)(uVar39 >> 3) & 1);
                                  auVar104._12_4_ =
                                       bVar17 * auVar103._12_4_ | (uint)!bVar17 * iVar27;
                                  bVar17 = (bool)((byte)(uVar39 >> 4) & 1);
                                  auVar104._16_4_ =
                                       bVar17 * auVar103._16_4_ | (uint)!bVar17 * iVar28;
                                  bVar17 = (bool)((byte)(uVar39 >> 5) & 1);
                                  auVar104._20_4_ =
                                       bVar17 * auVar103._20_4_ | (uint)!bVar17 * iVar29;
                                  bVar17 = (bool)((byte)(uVar39 >> 6) & 1);
                                  auVar104._24_4_ =
                                       bVar17 * auVar103._24_4_ | (uint)!bVar17 * iVar30;
                                  bVar17 = SUB81(uVar39 >> 7,0);
                                  auVar104._28_4_ =
                                       bVar17 * auVar103._28_4_ | (uint)!bVar17 * iVar31;
                                  auVar73 = vmovdqu32_avx512vl(*(undefined1 (*) [32])
                                                                (local_460.hit + 0xc0));
                                  *(undefined1 (*) [32])(local_460.ray + 0x240) = auVar73;
                                  bVar17 = (bool)((byte)(uVar39 >> 1) & 1);
                                  uVar107 = bVar17 * uVar107 | (uint)!bVar17 * iVar108;
                                  auVar25._4_24_ = auVar104._8_24_;
                                  auVar25._0_4_ = uVar107;
                                  auVar105._0_8_ = auVar25._0_8_ << 0x20;
                                  bVar17 = (bool)((byte)(uVar39 >> 2) & 1);
                                  auVar105._8_4_ = bVar17 * auVar104._8_4_ | (uint)!bVar17 * iVar260
                                  ;
                                  bVar17 = (bool)((byte)(uVar39 >> 3) & 1);
                                  auVar105._12_4_ =
                                       bVar17 * auVar104._12_4_ | (uint)!bVar17 * iVar27;
                                  bVar17 = (bool)((byte)(uVar39 >> 4) & 1);
                                  auVar105._16_4_ =
                                       bVar17 * auVar104._16_4_ | (uint)!bVar17 * iVar28;
                                  bVar17 = (bool)((byte)(uVar39 >> 5) & 1);
                                  auVar105._20_4_ =
                                       bVar17 * auVar104._20_4_ | (uint)!bVar17 * iVar29;
                                  bVar17 = (bool)((byte)(uVar39 >> 6) & 1);
                                  auVar105._24_4_ =
                                       bVar17 * auVar104._24_4_ | (uint)!bVar17 * iVar30;
                                  bVar17 = SUB81(uVar39 >> 7,0);
                                  auVar105._28_4_ =
                                       bVar17 * auVar104._28_4_ | (uint)!bVar17 * iVar31;
                                  auVar73 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                                (local_460.hit + 0xe0));
                                  *(undefined1 (*) [32])(local_460.ray + 0x260) = auVar73;
                                  bVar17 = (bool)((byte)(uVar39 >> 1) & 1);
                                  auVar26._4_24_ = auVar105._8_24_;
                                  auVar26._0_4_ = bVar17 * uVar107 | (uint)!bVar17 * iVar108;
                                  auVar106._0_8_ = auVar26._0_8_ << 0x20;
                                  bVar17 = (bool)((byte)(uVar39 >> 2) & 1);
                                  auVar106._8_4_ = bVar17 * auVar105._8_4_ | (uint)!bVar17 * iVar260
                                  ;
                                  bVar17 = (bool)((byte)(uVar39 >> 3) & 1);
                                  auVar106._12_4_ =
                                       bVar17 * auVar105._12_4_ | (uint)!bVar17 * iVar27;
                                  bVar17 = (bool)((byte)(uVar39 >> 4) & 1);
                                  auVar106._16_4_ =
                                       bVar17 * auVar105._16_4_ | (uint)!bVar17 * iVar28;
                                  bVar17 = (bool)((byte)(uVar39 >> 5) & 1);
                                  auVar106._20_4_ =
                                       bVar17 * auVar105._20_4_ | (uint)!bVar17 * iVar29;
                                  bVar17 = (bool)((byte)(uVar39 >> 6) & 1);
                                  auVar106._24_4_ =
                                       bVar17 * auVar105._24_4_ | (uint)!bVar17 * iVar30;
                                  bVar17 = SUB81(uVar39 >> 7,0);
                                  auVar106._28_4_ =
                                       bVar17 * auVar105._28_4_ | (uint)!bVar17 * iVar31;
                                  auVar73._16_16_ = auVar106._16_16_;
                                  auVar87 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                                (local_460.hit + 0x100));
                                  *(undefined1 (*) [32])(local_460.ray + 0x280) = auVar87;
                                }
                                auVar48 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                auVar259 = ZEXT1664(auVar48);
                                auVar48 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                auVar255 = ZEXT1664(auVar48);
                              }
                              auVar245 = ZEXT1664(auVar56);
                            }
                          }
                        }
                      }
                    }
                    goto LAB_01b4080e;
                  }
                  break;
                }
                lVar40 = lVar40 + -1;
              } while (lVar40 != 0);
            }
            auVar245 = ZEXT1664(auVar56);
          }
          else {
            auVar48 = vxorps_avx512vl(ZEXT416(5),auVar64);
            auVar261 = ZEXT1664(auVar48);
          }
        }
        else {
          auVar245 = ZEXT1664(auVar242);
        }
      }
LAB_01b4080e:
    } while (bVar10);
    auVar44 = vinsertps_avx512f(auVar47,auVar44,0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_hn(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }